

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  ulong uVar72;
  byte bVar73;
  ulong uVar74;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined8 in_R10;
  long lVar75;
  bool bVar76;
  uint uVar77;
  uint uVar143;
  uint uVar144;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  uint uVar145;
  uint uVar149;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float pp;
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar158 [32];
  float fVar169;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar184 [16];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 in_ZMM4 [64];
  float fVar240;
  undefined1 auVar237 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar235 [16];
  undefined1 auVar239 [64];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [64];
  float fVar246;
  float fVar253;
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar250 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  float fVar258;
  undefined1 auVar257 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  float fVar265;
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b1c;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 (*local_818) [32];
  Primitive *local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar74 = (ulong)(byte)prim[1];
  fVar246 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar82 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar83 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar208 = fVar246 * auVar83._0_4_;
  fVar150 = fVar246 * auVar82._0_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar14);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar95 = vpmovsxbd_avx2(auVar15);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar80);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar74 * 0xc + 6);
  auVar100 = vpmovsxbd_avx2(auVar78);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar98 = vpmovsxbd_avx2(auVar90);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar86);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar74 * 0x13 + 6);
  auVar102 = vpmovsxbd_avx2(auVar79);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar74 * 0x14 + 6);
  auVar104 = vpmovsxbd_avx2(auVar81);
  auVar103 = vcvtdq2ps_avx(auVar104);
  auVar111._4_4_ = fVar150;
  auVar111._0_4_ = fVar150;
  auVar111._8_4_ = fVar150;
  auVar111._12_4_ = fVar150;
  auVar111._16_4_ = fVar150;
  auVar111._20_4_ = fVar150;
  auVar111._24_4_ = fVar150;
  auVar111._28_4_ = fVar150;
  auVar113._8_4_ = 1;
  auVar113._0_8_ = 0x100000001;
  auVar113._12_4_ = 1;
  auVar113._16_4_ = 1;
  auVar113._20_4_ = 1;
  auVar113._24_4_ = 1;
  auVar113._28_4_ = 1;
  auVar94 = ZEXT1632(CONCAT412(fVar246 * auVar82._12_4_,
                               CONCAT48(fVar246 * auVar82._8_4_,
                                        CONCAT44(fVar246 * auVar82._4_4_,fVar150))));
  auVar93 = vpermps_avx2(auVar113,auVar94);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = vpermps_avx512vl(auVar91,auVar94);
  fVar150 = auVar92._0_4_;
  auVar239._0_4_ = fVar150 * auVar96._0_4_;
  fVar251 = auVar92._4_4_;
  auVar239._4_4_ = fVar251 * auVar96._4_4_;
  fVar252 = auVar92._8_4_;
  auVar239._8_4_ = fVar252 * auVar96._8_4_;
  fVar253 = auVar92._12_4_;
  auVar239._12_4_ = fVar253 * auVar96._12_4_;
  fVar226 = auVar92._16_4_;
  auVar239._16_4_ = fVar226 * auVar96._16_4_;
  fVar227 = auVar92._20_4_;
  auVar239._20_4_ = fVar227 * auVar96._20_4_;
  fVar228 = auVar92._24_4_;
  auVar239._28_36_ = in_ZMM4._28_36_;
  auVar239._24_4_ = fVar228 * auVar96._24_4_;
  auVar94._4_4_ = auVar98._4_4_ * fVar251;
  auVar94._0_4_ = auVar98._0_4_ * fVar150;
  auVar94._8_4_ = auVar98._8_4_ * fVar252;
  auVar94._12_4_ = auVar98._12_4_ * fVar253;
  auVar94._16_4_ = auVar98._16_4_ * fVar226;
  auVar94._20_4_ = auVar98._20_4_ * fVar227;
  auVar94._24_4_ = auVar98._24_4_ * fVar228;
  auVar94._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = auVar103._4_4_ * fVar251;
  auVar104._0_4_ = auVar103._0_4_ * fVar150;
  auVar104._8_4_ = auVar103._8_4_ * fVar252;
  auVar104._12_4_ = auVar103._12_4_ * fVar253;
  auVar104._16_4_ = auVar103._16_4_ * fVar226;
  auVar104._20_4_ = auVar103._20_4_ * fVar227;
  auVar104._24_4_ = auVar103._24_4_ * fVar228;
  auVar104._28_4_ = auVar92._28_4_;
  auVar14 = vfmadd231ps_fma(auVar239._0_32_,auVar93,auVar95);
  auVar15 = vfmadd231ps_fma(auVar94,auVar93,auVar100);
  auVar80 = vfmadd231ps_fma(auVar104,auVar102,auVar93);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar111,auVar97);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar111,auVar99);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar101,auVar111);
  auVar112._4_4_ = fVar208;
  auVar112._0_4_ = fVar208;
  auVar112._8_4_ = fVar208;
  auVar112._12_4_ = fVar208;
  auVar112._16_4_ = fVar208;
  auVar112._20_4_ = fVar208;
  auVar112._24_4_ = fVar208;
  auVar112._28_4_ = fVar208;
  auVar93 = ZEXT1632(CONCAT412(fVar246 * auVar83._12_4_,
                               CONCAT48(fVar246 * auVar83._8_4_,
                                        CONCAT44(fVar246 * auVar83._4_4_,fVar208))));
  auVar104 = vpermps_avx2(auVar113,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  auVar94 = vmulps_avx512vl(auVar93,auVar96);
  auVar106._0_4_ = auVar93._0_4_ * auVar98._0_4_;
  auVar106._4_4_ = auVar93._4_4_ * auVar98._4_4_;
  auVar106._8_4_ = auVar93._8_4_ * auVar98._8_4_;
  auVar106._12_4_ = auVar93._12_4_ * auVar98._12_4_;
  auVar106._16_4_ = auVar93._16_4_ * auVar98._16_4_;
  auVar106._20_4_ = auVar93._20_4_ * auVar98._20_4_;
  auVar106._24_4_ = auVar93._24_4_ * auVar98._24_4_;
  auVar106._28_4_ = 0;
  auVar98._4_4_ = auVar93._4_4_ * auVar103._4_4_;
  auVar98._0_4_ = auVar93._0_4_ * auVar103._0_4_;
  auVar98._8_4_ = auVar93._8_4_ * auVar103._8_4_;
  auVar98._12_4_ = auVar93._12_4_ * auVar103._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * auVar103._16_4_;
  auVar98._20_4_ = auVar93._20_4_ * auVar103._20_4_;
  auVar98._24_4_ = auVar93._24_4_ * auVar103._24_4_;
  auVar98._28_4_ = auVar96._28_4_;
  auVar95 = vfmadd231ps_avx512vl(auVar94,auVar104,auVar95);
  auVar85 = vfmadd231ps_fma(auVar106,auVar104,auVar100);
  auVar78 = vfmadd231ps_fma(auVar98,auVar104,auVar102);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar112,auVar97);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar112,auVar99);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar112,auVar101);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar97 = vandps_avx(ZEXT1632(auVar14),auVar108);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar97,auVar110,1);
  bVar76 = (bool)((byte)uVar72 & 1);
  auVar93._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar14._0_4_;
  bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar14._4_4_;
  bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar14._8_4_;
  bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar14._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar15),auVar108);
  uVar72 = vcmpps_avx512vl(auVar97,auVar110,1);
  bVar76 = (bool)((byte)uVar72 & 1);
  auVar91._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar15._0_4_;
  bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar15._4_4_;
  bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar15._8_4_;
  bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar15._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(ZEXT1632(auVar80),auVar108);
  uVar72 = vcmpps_avx512vl(auVar97,auVar110,1);
  bVar76 = (bool)((byte)uVar72 & 1);
  auVar97._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._0_4_;
  bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._4_4_;
  bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._8_4_;
  bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar80._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar93);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar93,auVar96,auVar109);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar91);
  auVar15 = vfnmadd213ps_fma(auVar91,auVar96,auVar109);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar97);
  auVar80 = vfnmadd213ps_fma(auVar97,auVar96,auVar109);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar96,auVar96);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx512vl(auVar97,auVar95);
  auVar101._4_4_ = auVar14._4_4_ * auVar97._4_4_;
  auVar101._0_4_ = auVar14._0_4_ * auVar97._0_4_;
  auVar101._8_4_ = auVar14._8_4_ * auVar97._8_4_;
  auVar101._12_4_ = auVar14._12_4_ * auVar97._12_4_;
  auVar101._16_4_ = auVar97._16_4_ * 0.0;
  auVar101._20_4_ = auVar97._20_4_ * 0.0;
  auVar101._24_4_ = auVar97._24_4_ * 0.0;
  auVar101._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx512vl(auVar97,auVar95);
  auVar107._0_4_ = auVar14._0_4_ * auVar97._0_4_;
  auVar107._4_4_ = auVar14._4_4_ * auVar97._4_4_;
  auVar107._8_4_ = auVar14._8_4_ * auVar97._8_4_;
  auVar107._12_4_ = auVar14._12_4_ * auVar97._12_4_;
  auVar107._16_4_ = auVar97._16_4_ * 0.0;
  auVar107._20_4_ = auVar97._20_4_ * 0.0;
  auVar107._24_4_ = auVar97._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0xe + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar85));
  auVar98 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar102._4_4_ = auVar15._4_4_ * auVar97._4_4_;
  auVar102._0_4_ = auVar15._0_4_ * auVar97._0_4_;
  auVar102._8_4_ = auVar15._8_4_ * auVar97._8_4_;
  auVar102._12_4_ = auVar15._12_4_ * auVar97._12_4_;
  auVar102._16_4_ = auVar97._16_4_ * 0.0;
  auVar102._20_4_ = auVar97._20_4_ * 0.0;
  auVar102._24_4_ = auVar97._24_4_ * 0.0;
  auVar102._28_4_ = auVar97._28_4_;
  auVar97 = vcvtdq2ps_avx(auVar95);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar85));
  auVar105._0_4_ = auVar15._0_4_ * auVar97._0_4_;
  auVar105._4_4_ = auVar15._4_4_ * auVar97._4_4_;
  auVar105._8_4_ = auVar15._8_4_ * auVar97._8_4_;
  auVar105._12_4_ = auVar15._12_4_ * auVar97._12_4_;
  auVar105._16_4_ = auVar97._16_4_ * 0.0;
  auVar105._20_4_ = auVar97._20_4_ * 0.0;
  auVar105._24_4_ = auVar97._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x15 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar78));
  auVar103._4_4_ = auVar97._4_4_ * auVar80._4_4_;
  auVar103._0_4_ = auVar97._0_4_ * auVar80._0_4_;
  auVar103._8_4_ = auVar97._8_4_ * auVar80._8_4_;
  auVar103._12_4_ = auVar97._12_4_ * auVar80._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar78));
  auVar92._0_4_ = auVar80._0_4_ * auVar97._0_4_;
  auVar92._4_4_ = auVar80._4_4_ * auVar97._4_4_;
  auVar92._8_4_ = auVar80._8_4_ * auVar97._8_4_;
  auVar92._12_4_ = auVar80._12_4_ * auVar97._12_4_;
  auVar92._16_4_ = auVar97._16_4_ * 0.0;
  auVar92._20_4_ = auVar97._20_4_ * 0.0;
  auVar92._24_4_ = auVar97._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar101,auVar107);
  auVar95 = vpminsd_avx2(auVar102,auVar105);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95 = vpminsd_avx2(auVar103,auVar92);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar96._4_4_ = uVar173;
  auVar96._0_4_ = uVar173;
  auVar96._8_4_ = uVar173;
  auVar96._12_4_ = uVar173;
  auVar96._16_4_ = uVar173;
  auVar96._20_4_ = uVar173;
  auVar96._24_4_ = uVar173;
  auVar96._28_4_ = uVar173;
  auVar95 = vmaxps_avx512vl(auVar95,auVar96);
  auVar97 = vmaxps_avx(auVar97,auVar95);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  auVar95._16_4_ = 0x3f7ffffa;
  auVar95._20_4_ = 0x3f7ffffa;
  auVar95._24_4_ = 0x3f7ffffa;
  auVar95._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar97,auVar95);
  auVar97 = vpmaxsd_avx2(auVar101,auVar107);
  auVar95 = vpmaxsd_avx2(auVar102,auVar105);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar95 = vpmaxsd_avx2(auVar103,auVar92);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar99._4_4_ = uVar173;
  auVar99._0_4_ = uVar173;
  auVar99._8_4_ = uVar173;
  auVar99._12_4_ = uVar173;
  auVar99._16_4_ = uVar173;
  auVar99._20_4_ = uVar173;
  auVar99._24_4_ = uVar173;
  auVar99._28_4_ = uVar173;
  auVar95 = vminps_avx512vl(auVar95,auVar99);
  auVar97 = vminps_avx(auVar97,auVar95);
  auVar100._8_4_ = 0x3f800003;
  auVar100._0_8_ = 0x3f8000033f800003;
  auVar100._12_4_ = 0x3f800003;
  auVar100._16_4_ = 0x3f800003;
  auVar100._20_4_ = 0x3f800003;
  auVar100._24_4_ = 0x3f800003;
  auVar100._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar100);
  uVar18 = vcmpps_avx512vl(local_300,auVar97,2);
  uVar21 = vpcmpgtd_avx512vl(auVar98,_DAT_01fb4ba0);
  local_808 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar18 & (byte)uVar21));
  local_818 = (undefined1 (*) [32])&local_3a0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_810 = prim;
LAB_01a9e573:
  if (local_808 == 0) {
    return;
  }
  lVar75 = 0;
  for (uVar72 = local_808; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar75 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar1].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar75 = *(long *)&pGVar4[1].time_range.upper;
  auVar14 = *(undefined1 (*) [16])(lVar75 + (long)p_Var5 * uVar72);
  auVar15 = *(undefined1 (*) [16])(lVar75 + (uVar72 + 1) * (long)p_Var5);
  auVar80 = *(undefined1 (*) [16])(lVar75 + (uVar72 + 2) * (long)p_Var5);
  local_808 = local_808 - 1 & local_808;
  auVar85 = *(undefined1 (*) [16])(lVar75 + (uVar72 + 3) * (long)p_Var5);
  if (local_808 != 0) {
    uVar74 = local_808 - 1 & local_808;
    for (uVar72 = local_808; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar90 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar173;
  auVar84._0_4_ = uVar173;
  auVar84._8_4_ = uVar173;
  auVar84._12_4_ = uVar173;
  local_5e0._16_4_ = uVar173;
  local_5e0._0_16_ = auVar84;
  local_5e0._20_4_ = uVar173;
  local_5e0._24_4_ = uVar173;
  local_5e0._28_4_ = uVar173;
  auVar264 = ZEXT3264(local_5e0);
  uVar173 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar89._4_4_ = uVar173;
  auVar89._0_4_ = uVar173;
  auVar89._8_4_ = uVar173;
  auVar89._12_4_ = uVar173;
  local_4a0._16_4_ = uVar173;
  local_4a0._0_16_ = auVar89;
  local_4a0._20_4_ = uVar173;
  local_4a0._24_4_ = uVar173;
  local_4a0._28_4_ = uVar173;
  auVar78 = vunpcklps_avx(auVar84,auVar89);
  fVar246 = *(float *)(ray + k * 4 + 0xc0);
  auVar254._4_4_ = fVar246;
  auVar254._0_4_ = fVar246;
  auVar254._8_4_ = fVar246;
  auVar254._12_4_ = fVar246;
  local_600._16_4_ = fVar246;
  local_600._0_16_ = auVar254;
  local_600._20_4_ = fVar246;
  local_600._24_4_ = fVar246;
  local_600._28_4_ = fVar246;
  local_7d0 = vinsertps_avx(auVar78,auVar254,0x28);
  auVar255 = ZEXT1664(local_7d0);
  auVar83._0_4_ = auVar14._0_4_ + auVar15._0_4_ + auVar80._0_4_ + auVar85._0_4_;
  auVar83._4_4_ = auVar14._4_4_ + auVar15._4_4_ + auVar80._4_4_ + auVar85._4_4_;
  auVar83._8_4_ = auVar14._8_4_ + auVar15._8_4_ + auVar80._8_4_ + auVar85._8_4_;
  auVar83._12_4_ = auVar14._12_4_ + auVar15._12_4_ + auVar80._12_4_ + auVar85._12_4_;
  auVar82._8_4_ = 0x3e800000;
  auVar82._0_8_ = 0x3e8000003e800000;
  auVar82._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar83,auVar82);
  auVar78 = vsubps_avx(auVar78,auVar90);
  auVar78 = vdpps_avx(auVar78,local_7d0,0x7f);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar257 = ZEXT1664(local_7e0);
  fVar150 = *(float *)(ray + k * 4 + 0x60);
  auVar259 = ZEXT464((uint)fVar150);
  auVar87._4_12_ = ZEXT812(0) << 0x20;
  auVar87._0_4_ = local_7e0._0_4_;
  auVar79 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar87);
  auVar86 = vfnmadd213ss_fma(auVar79,local_7e0,ZEXT416(0x40000000));
  local_2e0 = auVar78._0_4_ * auVar79._0_4_ * auVar86._0_4_;
  auVar88._4_4_ = local_2e0;
  auVar88._0_4_ = local_2e0;
  auVar88._8_4_ = local_2e0;
  auVar88._12_4_ = local_2e0;
  fStack_590 = local_2e0;
  _local_5a0 = auVar88;
  fStack_58c = local_2e0;
  fStack_588 = local_2e0;
  fStack_584 = local_2e0;
  auVar78 = vfmadd231ps_fma(auVar90,local_7d0,auVar88);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar14 = vsubps_avx(auVar14,auVar78);
  auVar80 = vsubps_avx(auVar80,auVar78);
  auVar245 = ZEXT1664(auVar80);
  auVar15 = vsubps_avx(auVar15,auVar78);
  auVar250 = ZEXT1664(auVar15);
  auVar85 = vsubps_avx(auVar85,auVar78);
  auVar97 = vbroadcastss_avx512vl(auVar14);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_760 = ZEXT1632(auVar14);
  auVar95 = vpermps_avx512vl(auVar115,local_760);
  auVar116._8_4_ = 2;
  auVar116._0_8_ = 0x200000002;
  auVar116._12_4_ = 2;
  auVar116._16_4_ = 2;
  auVar116._20_4_ = 2;
  auVar116._24_4_ = 2;
  auVar116._28_4_ = 2;
  auVar96 = vpermps_avx512vl(auVar116,local_760);
  auVar117._8_4_ = 3;
  auVar117._0_8_ = 0x300000003;
  auVar117._12_4_ = 3;
  auVar117._16_4_ = 3;
  auVar117._20_4_ = 3;
  auVar117._24_4_ = 3;
  auVar117._28_4_ = 3;
  auVar99 = vpermps_avx512vl(auVar117,local_760);
  auVar100 = vbroadcastss_avx512vl(auVar15);
  local_7a0 = ZEXT1632(auVar15);
  auVar98 = vpermps_avx512vl(auVar115,local_7a0);
  auVar101 = vpermps_avx512vl(auVar116,local_7a0);
  auVar102 = vpermps_avx512vl(auVar117,local_7a0);
  auVar103 = vbroadcastss_avx512vl(auVar80);
  local_780 = ZEXT1632(auVar80);
  auVar104 = vpermps_avx512vl(auVar115,local_780);
  auVar93 = vpermps_avx512vl(auVar116,local_780);
  auVar94 = vpermps_avx512vl(auVar117,local_780);
  local_260 = vbroadcastss_avx512vl(auVar85);
  _local_7c0 = ZEXT1632(auVar85);
  local_280 = vpermps_avx2(auVar115,_local_7c0);
  local_240 = vpermps_avx512vl(auVar116,_local_7c0);
  local_2c0 = vpermps_avx2(auVar117,_local_7c0);
  auVar14 = vfmadd231ps_fma(ZEXT432((uint)(fVar246 * fVar246)),local_4a0,local_4a0);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_5e0,local_5e0);
  local_220._0_4_ = auVar14._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar114);
  local_700 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar150 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  uVar72 = 0;
  local_b1c = 1;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar14 = vsqrtss_avx(local_7e0,local_7e0);
  auVar15 = vsqrtss_avx(local_7e0,local_7e0);
  local_530 = ZEXT816(0x3f80000000000000);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar266 = ZEXT3264(auVar91);
  auVar239 = ZEXT3264(_DAT_01f7b040);
  local_2a0 = local_240;
  do {
    auVar80 = vmovshdup_avx(local_530);
    auVar80 = vsubps_avx(auVar80,local_530);
    auVar158._0_4_ = auVar80._0_4_;
    fVar17 = auVar158._0_4_ * 0.04761905;
    uVar173 = local_530._0_4_;
    local_860._4_4_ = uVar173;
    local_860._0_4_ = uVar173;
    local_860._8_4_ = uVar173;
    local_860._12_4_ = uVar173;
    local_860._16_4_ = uVar173;
    local_860._20_4_ = uVar173;
    local_860._24_4_ = uVar173;
    local_860._28_4_ = uVar173;
    auVar158._4_4_ = auVar158._0_4_;
    auVar158._8_4_ = auVar158._0_4_;
    auVar158._12_4_ = auVar158._0_4_;
    auVar158._16_4_ = auVar158._0_4_;
    auVar158._20_4_ = auVar158._0_4_;
    auVar158._24_4_ = auVar158._0_4_;
    auVar158._28_4_ = auVar158._0_4_;
    auVar80 = vfmadd231ps_fma(local_860,auVar158,auVar239._0_32_);
    auVar92 = vsubps_avx512vl(auVar266._0_32_,ZEXT1632(auVar80));
    fVar246 = auVar92._0_4_;
    fVar252 = auVar92._4_4_;
    fVar226 = auVar92._8_4_;
    fVar228 = auVar92._12_4_;
    fVar265 = auVar92._16_4_;
    fVar190 = auVar92._20_4_;
    fVar16 = auVar92._24_4_;
    fVar151 = fVar246 * fVar246 * fVar246;
    fVar167 = fVar252 * fVar252 * fVar252;
    auVar118._4_4_ = fVar167;
    auVar118._0_4_ = fVar151;
    fVar168 = fVar226 * fVar226 * fVar226;
    auVar118._8_4_ = fVar168;
    fVar169 = fVar228 * fVar228 * fVar228;
    auVar118._12_4_ = fVar169;
    fVar170 = fVar265 * fVar265 * fVar265;
    auVar118._16_4_ = fVar170;
    fVar171 = fVar190 * fVar190 * fVar190;
    auVar118._20_4_ = fVar171;
    fVar172 = fVar16 * fVar16 * fVar16;
    auVar118._24_4_ = fVar172;
    auVar118._28_4_ = auVar158._0_4_;
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar105 = vmulps_avx512vl(auVar118,auVar91);
    fVar251 = auVar80._0_4_;
    fVar253 = auVar80._4_4_;
    fVar227 = auVar80._8_4_;
    fVar208 = auVar80._12_4_;
    fVar189 = fVar251 * fVar251 * fVar251;
    fVar205 = fVar253 * fVar253 * fVar253;
    fVar206 = fVar227 * fVar227 * fVar227;
    fVar207 = fVar208 * fVar208 * fVar208;
    auVar256._0_4_ = fVar251 * fVar246;
    auVar256._4_4_ = fVar253 * fVar252;
    auVar256._8_4_ = fVar227 * fVar226;
    auVar256._12_4_ = fVar208 * fVar228;
    auVar256._16_4_ = fVar265 * 0.0;
    auVar256._20_4_ = fVar190 * 0.0;
    auVar256._28_36_ = auVar255._28_36_;
    auVar256._24_4_ = fVar16 * 0.0;
    auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar189)
                                                                  ))),auVar91);
    fVar258 = auVar106._28_4_ + auVar158._0_4_;
    fVar240 = fVar258 + auVar259._28_4_ + auVar239._28_4_;
    auVar119._4_4_ = fVar167 * 0.16666667;
    auVar119._0_4_ = fVar151 * 0.16666667;
    auVar119._8_4_ = fVar168 * 0.16666667;
    auVar119._12_4_ = fVar169 * 0.16666667;
    auVar119._16_4_ = fVar170 * 0.16666667;
    auVar119._20_4_ = fVar171 * 0.16666667;
    auVar119._24_4_ = fVar172 * 0.16666667;
    auVar119._28_4_ = fVar258;
    auVar125._4_4_ =
         (auVar256._4_4_ * fVar252 * 12.0 + auVar256._4_4_ * fVar253 * 6.0 +
         fVar205 + auVar105._4_4_) * 0.16666667;
    auVar125._0_4_ =
         (auVar256._0_4_ * fVar246 * 12.0 + auVar256._0_4_ * fVar251 * 6.0 +
         fVar189 + auVar105._0_4_) * 0.16666667;
    auVar125._8_4_ =
         (auVar256._8_4_ * fVar226 * 12.0 + auVar256._8_4_ * fVar227 * 6.0 +
         fVar206 + auVar105._8_4_) * 0.16666667;
    auVar125._12_4_ =
         (auVar256._12_4_ * fVar228 * 12.0 + auVar256._12_4_ * fVar208 * 6.0 +
         fVar207 + auVar105._12_4_) * 0.16666667;
    auVar125._16_4_ =
         (auVar256._16_4_ * fVar265 * 12.0 + auVar256._16_4_ * 0.0 * 6.0 + auVar105._16_4_ + 0.0) *
         0.16666667;
    auVar125._20_4_ =
         (auVar256._20_4_ * fVar190 * 12.0 + auVar256._20_4_ * 0.0 * 6.0 + auVar105._20_4_ + 0.0) *
         0.16666667;
    auVar125._24_4_ =
         (auVar256._24_4_ * fVar16 * 12.0 + auVar256._24_4_ * 0.0 * 6.0 + auVar105._24_4_ + 0.0) *
         0.16666667;
    auVar125._28_4_ = auVar259._28_4_;
    auVar126._4_4_ =
         (auVar106._4_4_ + fVar167 +
         auVar256._4_4_ * fVar253 * 12.0 + auVar256._4_4_ * fVar252 * 6.0) * 0.16666667;
    auVar126._0_4_ =
         (auVar106._0_4_ + fVar151 +
         auVar256._0_4_ * fVar251 * 12.0 + auVar256._0_4_ * fVar246 * 6.0) * 0.16666667;
    auVar126._8_4_ =
         (auVar106._8_4_ + fVar168 +
         auVar256._8_4_ * fVar227 * 12.0 + auVar256._8_4_ * fVar226 * 6.0) * 0.16666667;
    auVar126._12_4_ =
         (auVar106._12_4_ + fVar169 +
         auVar256._12_4_ * fVar208 * 12.0 + auVar256._12_4_ * fVar228 * 6.0) * 0.16666667;
    auVar126._16_4_ =
         (auVar106._16_4_ + fVar170 + auVar256._16_4_ * 0.0 * 12.0 + auVar256._16_4_ * fVar265 * 6.0
         ) * 0.16666667;
    auVar126._20_4_ =
         (auVar106._20_4_ + fVar171 + auVar256._20_4_ * 0.0 * 12.0 + auVar256._20_4_ * fVar190 * 6.0
         ) * 0.16666667;
    auVar126._24_4_ =
         (auVar106._24_4_ + fVar172 + auVar256._24_4_ * 0.0 * 12.0 + auVar256._24_4_ * fVar16 * 6.0)
         * 0.16666667;
    auVar126._28_4_ = auVar264._28_4_;
    fVar189 = fVar189 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    auVar127._28_4_ = fVar240;
    auVar127._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar189))));
    auVar106 = vmulps_avx512vl(local_260,auVar127);
    auVar128._4_4_ = local_280._4_4_ * fVar205;
    auVar128._0_4_ = local_280._0_4_ * fVar189;
    auVar128._8_4_ = local_280._8_4_ * fVar206;
    auVar128._12_4_ = local_280._12_4_ * fVar207;
    auVar128._16_4_ = local_280._16_4_ * 0.0;
    auVar128._20_4_ = local_280._20_4_ * 0.0;
    auVar128._24_4_ = local_280._24_4_ * 0.0;
    auVar128._28_4_ = auVar257._28_4_ + auVar264._28_4_ + auVar105._28_4_ + 0.0;
    auVar105 = vmulps_avx512vl(local_2a0,auVar127);
    auVar129._4_4_ = local_2c0._4_4_ * fVar205;
    auVar129._0_4_ = local_2c0._0_4_ * fVar189;
    auVar129._8_4_ = local_2c0._8_4_ * fVar206;
    auVar129._12_4_ = local_2c0._12_4_ * fVar207;
    auVar129._16_4_ = local_2c0._16_4_ * 0.0;
    auVar129._20_4_ = local_2c0._20_4_ * 0.0;
    auVar129._24_4_ = local_2c0._24_4_ * 0.0;
    auVar129._28_4_ = fVar240;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar126,auVar103);
    auVar107 = vfmadd231ps_avx512vl(auVar128,auVar126,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar126,auVar93);
    auVar108 = vfmadd231ps_avx512vl(auVar129,auVar94,auVar126);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar125,auVar100);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar125,auVar98);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar125,auVar101);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,auVar125);
    auVar109 = vfmadd231ps_avx512vl(auVar106,auVar119,auVar97);
    auVar110 = vfmadd231ps_avx512vl(auVar107,auVar119,auVar95);
    auVar111 = vfmadd231ps_avx512vl(auVar105,auVar119,auVar96);
    auVar105 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar119);
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar106 = vxorps_avx512vl(auVar92,auVar112);
    auVar107 = vxorps_avx512vl(ZEXT1632(auVar80),auVar112);
    auVar231._0_4_ = auVar107._0_4_ * fVar251;
    auVar231._4_4_ = auVar107._4_4_ * fVar253;
    auVar231._8_4_ = auVar107._8_4_ * fVar227;
    auVar231._12_4_ = auVar107._12_4_ * fVar208;
    auVar231._16_4_ = auVar107._16_4_ * 0.0;
    auVar231._20_4_ = auVar107._20_4_ * 0.0;
    auVar231._24_4_ = auVar107._24_4_ * 0.0;
    auVar231._28_4_ = 0;
    auVar108 = vmulps_avx512vl(auVar256._0_32_,auVar91);
    auVar91 = vsubps_avx(auVar231,auVar108);
    auVar132._4_4_ = auVar106._4_4_ * fVar252 * 0.5;
    auVar132._0_4_ = auVar106._0_4_ * fVar246 * 0.5;
    auVar132._8_4_ = auVar106._8_4_ * fVar226 * 0.5;
    auVar132._12_4_ = auVar106._12_4_ * fVar228 * 0.5;
    auVar132._16_4_ = auVar106._16_4_ * fVar265 * 0.5;
    auVar132._20_4_ = auVar106._20_4_ * fVar190 * 0.5;
    auVar132._24_4_ = auVar106._24_4_ * fVar16 * 0.5;
    auVar132._28_4_ = auVar92._28_4_;
    auVar133._4_4_ = auVar91._4_4_ * 0.5;
    auVar133._0_4_ = auVar91._0_4_ * 0.5;
    auVar133._8_4_ = auVar91._8_4_ * 0.5;
    auVar133._12_4_ = auVar91._12_4_ * 0.5;
    auVar133._16_4_ = auVar91._16_4_ * 0.5;
    auVar133._20_4_ = auVar91._20_4_ * 0.5;
    auVar133._24_4_ = auVar91._24_4_ * 0.5;
    auVar133._28_4_ = auVar91._28_4_;
    auVar36._4_4_ = (auVar108._4_4_ + fVar252 * fVar252) * 0.5;
    auVar36._0_4_ = (auVar108._0_4_ + fVar246 * fVar246) * 0.5;
    auVar36._8_4_ = (auVar108._8_4_ + fVar226 * fVar226) * 0.5;
    auVar36._12_4_ = (auVar108._12_4_ + fVar228 * fVar228) * 0.5;
    auVar36._16_4_ = (auVar108._16_4_ + fVar265 * fVar265) * 0.5;
    auVar36._20_4_ = (auVar108._20_4_ + fVar190 * fVar190) * 0.5;
    auVar36._24_4_ = (auVar108._24_4_ + fVar16 * fVar16) * 0.5;
    auVar36._28_4_ = auVar108._28_4_ + auVar245._28_4_;
    fVar246 = fVar251 * fVar251 * 0.5;
    fVar251 = fVar253 * fVar253 * 0.5;
    fVar252 = fVar227 * fVar227 * 0.5;
    fVar253 = fVar208 * fVar208 * 0.5;
    auVar37._28_4_ = auVar250._28_4_;
    auVar37._0_28_ = ZEXT1628(CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(fVar251,fVar246))));
    auVar91 = vmulps_avx512vl(local_260,auVar37);
    auVar38._4_4_ = local_280._4_4_ * fVar251;
    auVar38._0_4_ = local_280._0_4_ * fVar246;
    auVar38._8_4_ = local_280._8_4_ * fVar252;
    auVar38._12_4_ = local_280._12_4_ * fVar253;
    auVar38._16_4_ = local_280._16_4_ * 0.0;
    auVar38._20_4_ = local_280._20_4_ * 0.0;
    auVar38._24_4_ = local_280._24_4_ * 0.0;
    auVar38._28_4_ = auVar107._28_4_;
    auVar92 = vmulps_avx512vl(local_2a0,auVar37);
    auVar39._4_4_ = fVar251 * local_2c0._4_4_;
    auVar39._0_4_ = fVar246 * local_2c0._0_4_;
    auVar39._8_4_ = fVar252 * local_2c0._8_4_;
    auVar39._12_4_ = fVar253 * local_2c0._12_4_;
    auVar39._16_4_ = local_2c0._16_4_ * 0.0;
    auVar39._20_4_ = local_2c0._20_4_ * 0.0;
    auVar39._24_4_ = local_2c0._24_4_ * 0.0;
    auVar39._28_4_ = auVar250._28_4_;
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar36,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar38,auVar36,auVar104);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar36,auVar93);
    auVar80 = vfmadd231ps_fma(auVar39,auVar94,auVar36);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar133,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar133,auVar98);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar133,auVar101);
    auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar102,auVar133);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar132,auVar97);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar132,auVar95);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar132,auVar96);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar132);
    auVar40._4_4_ = auVar91._4_4_ * fVar17;
    auVar40._0_4_ = auVar91._0_4_ * fVar17;
    auVar40._8_4_ = auVar91._8_4_ * fVar17;
    auVar40._12_4_ = auVar91._12_4_ * fVar17;
    auVar40._16_4_ = auVar91._16_4_ * fVar17;
    auVar40._20_4_ = auVar91._20_4_ * fVar17;
    auVar40._24_4_ = auVar91._24_4_ * fVar17;
    auVar40._28_4_ = auVar94._28_4_;
    auVar264 = ZEXT3264(auVar40);
    auVar41._4_4_ = auVar106._4_4_ * fVar17;
    auVar41._0_4_ = auVar106._0_4_ * fVar17;
    auVar41._8_4_ = auVar106._8_4_ * fVar17;
    auVar41._12_4_ = auVar106._12_4_ * fVar17;
    auVar41._16_4_ = auVar106._16_4_ * fVar17;
    auVar41._20_4_ = auVar106._20_4_ * fVar17;
    auVar41._24_4_ = auVar106._24_4_ * fVar17;
    auVar41._28_4_ = 0x3e2aaaab;
    auVar42._4_4_ = auVar92._4_4_ * fVar17;
    auVar42._0_4_ = auVar92._0_4_ * fVar17;
    auVar42._8_4_ = auVar92._8_4_ * fVar17;
    auVar42._12_4_ = auVar92._12_4_ * fVar17;
    auVar42._16_4_ = auVar92._16_4_ * fVar17;
    auVar42._20_4_ = auVar92._20_4_ * fVar17;
    auVar42._24_4_ = auVar92._24_4_ * fVar17;
    auVar42._28_4_ = 0x40c00000;
    fVar246 = auVar107._0_4_ * fVar17;
    fVar251 = auVar107._4_4_ * fVar17;
    auVar43._4_4_ = fVar251;
    auVar43._0_4_ = fVar246;
    fVar252 = auVar107._8_4_ * fVar17;
    auVar43._8_4_ = fVar252;
    fVar253 = auVar107._12_4_ * fVar17;
    auVar43._12_4_ = fVar253;
    fVar226 = auVar107._16_4_ * fVar17;
    auVar43._16_4_ = fVar226;
    fVar227 = auVar107._20_4_ * fVar17;
    auVar43._20_4_ = fVar227;
    fVar228 = auVar107._24_4_ * fVar17;
    auVar43._24_4_ = fVar228;
    auVar43._28_4_ = fVar17;
    auVar80 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
    auVar113 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar80));
    auVar255 = ZEXT3264(auVar113);
    auVar114 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,ZEXT1632(auVar80));
    auVar257 = ZEXT3264(auVar114);
    auVar106 = ZEXT1632(auVar80);
    auVar115 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,auVar106);
    auVar259 = ZEXT3264(auVar115);
    auVar232._0_4_ = fVar246 + auVar105._0_4_;
    auVar232._4_4_ = fVar251 + auVar105._4_4_;
    auVar232._8_4_ = fVar252 + auVar105._8_4_;
    auVar232._12_4_ = fVar253 + auVar105._12_4_;
    auVar232._16_4_ = fVar226 + auVar105._16_4_;
    auVar232._20_4_ = fVar227 + auVar105._20_4_;
    auVar232._24_4_ = fVar228 + auVar105._24_4_;
    auVar232._28_4_ = fVar17 + auVar105._28_4_;
    auVar91 = vmaxps_avx(auVar105,auVar232);
    auVar92 = vminps_avx(auVar105,auVar232);
    auVar116 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar106);
    auVar117 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar106);
    auVar118 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar106);
    auVar132 = ZEXT1632(auVar80);
    auVar119 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar132);
    auVar105 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar132);
    auVar120 = vsubps_avx512vl(auVar116,auVar105);
    auVar105 = vsubps_avx(auVar113,auVar109);
    auVar250 = ZEXT3264(auVar105);
    auVar106 = vsubps_avx(auVar114,auVar110);
    auVar245 = ZEXT3264(auVar106);
    auVar107 = vsubps_avx(auVar115,auVar111);
    auVar108 = vmulps_avx512vl(auVar106,auVar42);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar41,auVar107);
    auVar121 = vmulps_avx512vl(auVar107,auVar40);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar42,auVar105);
    auVar122 = vmulps_avx512vl(auVar105,auVar41);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar40,auVar106);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar108,auVar108);
    auVar108 = vmulps_avx512vl(auVar107,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
    auVar123 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar122 = vrcp14ps_avx512vl(auVar123);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar124 = vfnmadd213ps_avx512vl(auVar122,auVar123,auVar108);
    auVar122 = vfmadd132ps_avx512vl(auVar124,auVar122,auVar122);
    auVar121 = vmulps_avx512vl(auVar121,auVar122);
    auVar124 = vmulps_avx512vl(auVar106,auVar119);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar118,auVar107);
    auVar125 = vmulps_avx512vl(auVar107,auVar117);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar119,auVar105);
    auVar126 = vmulps_avx512vl(auVar105,auVar118);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar117,auVar106);
    auVar126 = vmulps_avx512vl(auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar122 = vmulps_avx512vl(auVar124,auVar122);
    auVar121 = vmaxps_avx512vl(auVar121,auVar122);
    auVar121 = vsqrtps_avx512vl(auVar121);
    auVar122 = vmaxps_avx512vl(auVar120,auVar116);
    auVar91 = vmaxps_avx512vl(auVar91,auVar122);
    auVar124 = vaddps_avx512vl(auVar121,auVar91);
    auVar91 = vminps_avx512vl(auVar120,auVar116);
    auVar91 = vminps_avx(auVar92,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar121);
    auVar120._8_4_ = 0x3f800002;
    auVar120._0_8_ = 0x3f8000023f800002;
    auVar120._12_4_ = 0x3f800002;
    auVar120._16_4_ = 0x3f800002;
    auVar120._20_4_ = 0x3f800002;
    auVar120._24_4_ = 0x3f800002;
    auVar120._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar124,auVar120);
    auVar121._8_4_ = 0x3f7ffffc;
    auVar121._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar121._12_4_ = 0x3f7ffffc;
    auVar121._16_4_ = 0x3f7ffffc;
    auVar121._20_4_ = 0x3f7ffffc;
    auVar121._24_4_ = 0x3f7ffffc;
    auVar121._28_4_ = 0x3f7ffffc;
    auVar91 = vmulps_avx512vl(auVar91,auVar121);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar116 = vrsqrt14ps_avx512vl(auVar123);
    auVar122._8_4_ = 0xbf000000;
    auVar122._0_8_ = 0xbf000000bf000000;
    auVar122._12_4_ = 0xbf000000;
    auVar122._16_4_ = 0xbf000000;
    auVar122._20_4_ = 0xbf000000;
    auVar122._24_4_ = 0xbf000000;
    auVar122._28_4_ = 0xbf000000;
    auVar120 = vmulps_avx512vl(auVar123,auVar122);
    fVar246 = auVar116._0_4_;
    fVar251 = auVar116._4_4_;
    fVar252 = auVar116._8_4_;
    fVar253 = auVar116._12_4_;
    fVar226 = auVar116._16_4_;
    fVar227 = auVar116._20_4_;
    fVar228 = auVar116._24_4_;
    auVar44._4_4_ = fVar251 * fVar251 * fVar251 * auVar120._4_4_;
    auVar44._0_4_ = fVar246 * fVar246 * fVar246 * auVar120._0_4_;
    auVar44._8_4_ = fVar252 * fVar252 * fVar252 * auVar120._8_4_;
    auVar44._12_4_ = fVar253 * fVar253 * fVar253 * auVar120._12_4_;
    auVar44._16_4_ = fVar226 * fVar226 * fVar226 * auVar120._16_4_;
    auVar44._20_4_ = fVar227 * fVar227 * fVar227 * auVar120._20_4_;
    auVar44._24_4_ = fVar228 * fVar228 * fVar228 * auVar120._24_4_;
    auVar44._28_4_ = auVar124._28_4_;
    auVar123._8_4_ = 0x3fc00000;
    auVar123._0_8_ = 0x3fc000003fc00000;
    auVar123._12_4_ = 0x3fc00000;
    auVar123._16_4_ = 0x3fc00000;
    auVar123._20_4_ = 0x3fc00000;
    auVar123._24_4_ = 0x3fc00000;
    auVar123._28_4_ = 0x3fc00000;
    auVar116 = vfmadd231ps_avx512vl(auVar44,auVar116,auVar123);
    auVar120 = vmulps_avx512vl(auVar105,auVar116);
    auVar121 = vmulps_avx512vl(auVar106,auVar116);
    auVar122 = vmulps_avx512vl(auVar107,auVar116);
    auVar123 = vsubps_avx512vl(auVar132,auVar109);
    auVar125 = vsubps_avx512vl(auVar132,auVar110);
    auVar126 = vsubps_avx512vl(auVar132,auVar111);
    auVar124 = vmulps_avx512vl(local_600,auVar126);
    auVar124 = vfmadd231ps_avx512vl(auVar124,local_4a0,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar124,local_5e0,auVar123);
    auVar127 = vmulps_avx512vl(auVar126,auVar126);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar125,auVar125);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar123,auVar123);
    auVar128 = vmulps_avx512vl(local_600,auVar122);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar121,local_4a0);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar120,local_5e0);
    auVar122 = vmulps_avx512vl(auVar126,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar123,auVar120);
    auVar121 = vmulps_avx512vl(auVar128,auVar128);
    auVar122 = vsubps_avx512vl(local_220,auVar121);
    auVar129 = vmulps_avx512vl(auVar128,auVar120);
    auVar124 = vsubps_avx512vl(auVar124,auVar129);
    auVar129 = vaddps_avx512vl(auVar124,auVar124);
    auVar124 = vmulps_avx512vl(auVar120,auVar120);
    local_800 = vsubps_avx512vl(auVar127,auVar124);
    auVar92 = vsubps_avx512vl(local_800,auVar92);
    local_740 = vmulps_avx512vl(auVar129,auVar129);
    auVar124._8_4_ = 0x40800000;
    auVar124._0_8_ = 0x4080000040800000;
    auVar124._12_4_ = 0x40800000;
    auVar124._16_4_ = 0x40800000;
    auVar124._20_4_ = 0x40800000;
    auVar124._24_4_ = 0x40800000;
    auVar124._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar122,auVar124);
    auVar124 = vmulps_avx512vl(_local_880,auVar92);
    auVar124 = vsubps_avx512vl(local_740,auVar124);
    uVar74 = vcmpps_avx512vl(auVar124,auVar132,5);
    bVar67 = (byte)uVar74;
    if (bVar67 == 0) {
LAB_01a9f312:
      auVar266 = ZEXT3264(auVar108);
      auVar239 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar127 = vaddps_avx512vl(auVar122,auVar122);
      local_8a0 = vrcp14ps_avx512vl(auVar127);
      auVar108 = vfnmadd213ps_avx512vl(local_8a0,auVar127,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_8a0,local_8a0);
      _local_640 = vxorps_avx512vl(auVar129,auVar112);
      auVar112 = vsubps_avx512vl(_local_640,auVar124);
      local_620 = vmulps_avx512vl(auVar112,auVar108);
      auVar112 = vsubps_avx512vl(auVar124,auVar129);
      local_660 = vmulps_avx512vl(auVar112,auVar108);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112 = vblendmps_avx512vl(auVar108,local_620);
      auVar130._0_4_ =
           (uint)(bVar67 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar108._0_4_;
      bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar76 * auVar112._4_4_ | (uint)!bVar76 * auVar108._4_4_;
      bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar76 * auVar112._8_4_ | (uint)!bVar76 * auVar108._8_4_;
      bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar76 * auVar112._12_4_ | (uint)!bVar76 * auVar108._12_4_;
      bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar130._16_4_ = (uint)bVar76 * auVar112._16_4_ | (uint)!bVar76 * auVar108._16_4_;
      bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar130._20_4_ = (uint)bVar76 * auVar112._20_4_ | (uint)!bVar76 * auVar108._20_4_;
      bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar130._24_4_ = (uint)bVar76 * auVar112._24_4_ | (uint)!bVar76 * auVar108._24_4_;
      bVar76 = SUB81(uVar74 >> 7,0);
      auVar130._28_4_ = (uint)bVar76 * auVar112._28_4_ | (uint)!bVar76 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar108,local_660);
      auVar131._0_4_ =
           (uint)(bVar67 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar108._0_4_;
      bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar76 * auVar112._4_4_ | (uint)!bVar76 * auVar108._4_4_;
      bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar76 * auVar112._8_4_ | (uint)!bVar76 * auVar108._8_4_;
      bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar76 * auVar112._12_4_ | (uint)!bVar76 * auVar108._12_4_;
      bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar76 * auVar112._16_4_ | (uint)!bVar76 * auVar108._16_4_;
      bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar76 * auVar112._20_4_ | (uint)!bVar76 * auVar108._20_4_;
      bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar76 * auVar112._24_4_ | (uint)!bVar76 * auVar108._24_4_;
      bVar76 = SUB81(uVar74 >> 7,0);
      auVar131._28_4_ = (uint)bVar76 * auVar112._28_4_ | (uint)!bVar76 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar121,auVar108);
      local_680 = vmaxps_avx512vl(local_240,auVar108);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      local_6a0 = vmulps_avx512vl(local_680,auVar29);
      vandps_avx512vl(auVar122,auVar108);
      uVar19 = vcmpps_avx512vl(local_6a0,local_6a0,1);
      uVar74 = uVar74 & uVar19;
      bVar73 = (byte)uVar74;
      if (bVar73 != 0) {
        uVar19 = vcmpps_avx512vl(auVar92,_DAT_01f7b000,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar92,auVar108);
        bVar71 = (byte)uVar19;
        uVar77 = (uint)(bVar71 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar71 & 1) * local_6a0._0_4_;
        bVar76 = (bool)((byte)(uVar19 >> 1) & 1);
        uVar143 = (uint)bVar76 * auVar112._4_4_ | (uint)!bVar76 * local_6a0._4_4_;
        bVar76 = (bool)((byte)(uVar19 >> 2) & 1);
        uVar144 = (uint)bVar76 * auVar112._8_4_ | (uint)!bVar76 * local_6a0._8_4_;
        bVar76 = (bool)((byte)(uVar19 >> 3) & 1);
        uVar145 = (uint)bVar76 * auVar112._12_4_ | (uint)!bVar76 * local_6a0._12_4_;
        bVar76 = (bool)((byte)(uVar19 >> 4) & 1);
        uVar146 = (uint)bVar76 * auVar112._16_4_ | (uint)!bVar76 * local_6a0._16_4_;
        bVar76 = (bool)((byte)(uVar19 >> 5) & 1);
        uVar147 = (uint)bVar76 * auVar112._20_4_ | (uint)!bVar76 * local_6a0._20_4_;
        bVar76 = (bool)((byte)(uVar19 >> 6) & 1);
        uVar148 = (uint)bVar76 * auVar112._24_4_ | (uint)!bVar76 * local_6a0._24_4_;
        bVar76 = SUB81(uVar19 >> 7,0);
        uVar149 = (uint)bVar76 * auVar112._28_4_ | (uint)!bVar76 * local_6a0._28_4_;
        auVar130._0_4_ = (bVar73 & 1) * uVar77 | !(bool)(bVar73 & 1) * auVar130._0_4_;
        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar130._4_4_ = bVar76 * uVar143 | !bVar76 * auVar130._4_4_;
        bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar130._8_4_ = bVar76 * uVar144 | !bVar76 * auVar130._8_4_;
        bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar130._12_4_ = bVar76 * uVar145 | !bVar76 * auVar130._12_4_;
        bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar130._16_4_ = bVar76 * uVar146 | !bVar76 * auVar130._16_4_;
        bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar130._20_4_ = bVar76 * uVar147 | !bVar76 * auVar130._20_4_;
        bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar130._24_4_ = bVar76 * uVar148 | !bVar76 * auVar130._24_4_;
        bVar76 = SUB81(uVar74 >> 7,0);
        auVar130._28_4_ = bVar76 * uVar149 | !bVar76 * auVar130._28_4_;
        auVar92 = vblendmps_avx512vl(auVar108,auVar92);
        bVar76 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar19 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar19 >> 6) & 1);
        bVar13 = SUB81(uVar19 >> 7,0);
        auVar131._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar71 & 1) * auVar92._0_4_ | !(bool)(bVar71 & 1) * uVar77) |
             !(bool)(bVar73 & 1) * auVar131._0_4_;
        bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar131._4_4_ =
             (uint)bVar7 * ((uint)bVar76 * auVar92._4_4_ | !bVar76 * uVar143) |
             !bVar7 * auVar131._4_4_;
        bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar131._8_4_ =
             (uint)bVar76 * ((uint)bVar8 * auVar92._8_4_ | !bVar8 * uVar144) |
             !bVar76 * auVar131._8_4_;
        bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar131._12_4_ =
             (uint)bVar76 * ((uint)bVar9 * auVar92._12_4_ | !bVar9 * uVar145) |
             !bVar76 * auVar131._12_4_;
        bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar131._16_4_ =
             (uint)bVar76 * ((uint)bVar10 * auVar92._16_4_ | !bVar10 * uVar146) |
             !bVar76 * auVar131._16_4_;
        bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar131._20_4_ =
             (uint)bVar76 * ((uint)bVar11 * auVar92._20_4_ | !bVar11 * uVar147) |
             !bVar76 * auVar131._20_4_;
        bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar131._24_4_ =
             (uint)bVar76 * ((uint)bVar12 * auVar92._24_4_ | !bVar12 * uVar148) |
             !bVar76 * auVar131._24_4_;
        bVar76 = SUB81(uVar74 >> 7,0);
        auVar131._28_4_ =
             (uint)bVar76 * ((uint)bVar13 * auVar92._28_4_ | !bVar13 * uVar149) |
             !bVar76 * auVar131._28_4_;
        bVar67 = (~bVar73 | bVar71) & bVar67;
      }
      if ((bVar67 & 0x7f) == 0) {
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar266 = ZEXT3264(auVar91);
        auVar239 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar112 = vxorps_avx512vl(auVar119,auVar92);
        auVar117 = vxorps_avx512vl(auVar117,auVar92);
        auVar239 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar121 = vxorps_avx512vl(auVar118,auVar92);
        auVar80 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_700._0_4_));
        auVar108 = vbroadcastss_avx512vl(auVar80);
        auVar122 = vminps_avx512vl(auVar108,auVar131);
        auVar66._4_4_ = fStack_2dc;
        auVar66._0_4_ = local_2e0;
        auVar66._8_4_ = fStack_2d8;
        auVar66._12_4_ = fStack_2d4;
        auVar66._16_4_ = fStack_2d0;
        auVar66._20_4_ = fStack_2cc;
        auVar66._24_4_ = fStack_2c8;
        auVar66._28_4_ = fStack_2c4;
        auVar124 = vmaxps_avx512vl(auVar66,auVar130);
        auVar108 = vmulps_avx512vl(auVar42,auVar126);
        auVar108 = vfmadd213ps_avx512vl(auVar125,auVar41,auVar108);
        auVar80 = vfmadd213ps_fma(auVar123,auVar40,auVar108);
        auVar108 = vmulps_avx512vl(local_600,auVar42);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar41);
        auVar123 = vfmadd231ps_avx512vl(auVar108,local_5e0,auVar40);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar123,auVar118);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar18 = vcmpps_avx512vl(auVar118,auVar119,1);
        auVar125 = vxorps_avx512vl(ZEXT1632(auVar80),auVar92);
        auVar126 = vrcp14ps_avx512vl(auVar123);
        auVar132 = vxorps_avx512vl(auVar123,auVar92);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar133 = vfnmadd213ps_avx512vl(auVar126,auVar123,auVar108);
        auVar80 = vfmadd132ps_fma(auVar133,auVar126,auVar126);
        fVar246 = auVar80._0_4_ * auVar125._0_4_;
        fVar251 = auVar80._4_4_ * auVar125._4_4_;
        auVar45._4_4_ = fVar251;
        auVar45._0_4_ = fVar246;
        fVar252 = auVar80._8_4_ * auVar125._8_4_;
        auVar45._8_4_ = fVar252;
        fVar253 = auVar80._12_4_ * auVar125._12_4_;
        auVar45._12_4_ = fVar253;
        fVar226 = auVar125._16_4_ * 0.0;
        auVar45._16_4_ = fVar226;
        fVar227 = auVar125._20_4_ * 0.0;
        auVar45._20_4_ = fVar227;
        fVar228 = auVar125._24_4_ * 0.0;
        auVar45._24_4_ = fVar228;
        auVar45._28_4_ = auVar125._28_4_;
        uVar21 = vcmpps_avx512vl(auVar123,auVar132,1);
        bVar73 = (byte)uVar18 | (byte)uVar21;
        auVar262._8_4_ = 0xff800000;
        auVar262._0_8_ = 0xff800000ff800000;
        auVar262._12_4_ = 0xff800000;
        auVar262._16_4_ = 0xff800000;
        auVar262._20_4_ = 0xff800000;
        auVar262._24_4_ = 0xff800000;
        auVar262._28_4_ = 0xff800000;
        auVar126 = vblendmps_avx512vl(auVar45,auVar262);
        auVar134._0_4_ = (uint)(bVar73 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar73 & 1) * -0x800000
        ;
        bVar76 = (bool)(bVar73 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar76 * auVar126._4_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar73 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar76 * auVar126._8_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar73 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar76 * auVar126._12_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar73 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar76 * auVar126._16_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar73 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar76 * auVar126._20_4_ | (uint)!bVar76 * -0x800000;
        bVar76 = (bool)(bVar73 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar76 * auVar126._24_4_ | (uint)!bVar76 * -0x800000;
        auVar134._28_4_ =
             (uint)(bVar73 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar73 >> 7) * -0x800000;
        auVar126 = vmaxps_avx512vl(auVar124,auVar134);
        auVar264 = ZEXT3264(auVar126);
        uVar21 = vcmpps_avx512vl(auVar123,auVar132,6);
        bVar73 = (byte)uVar18 | (byte)uVar21;
        auVar135._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * (int)fVar246;
        bVar76 = (bool)(bVar73 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar251;
        bVar76 = (bool)(bVar73 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar252;
        bVar76 = (bool)(bVar73 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar253;
        bVar76 = (bool)(bVar73 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar226;
        bVar76 = (bool)(bVar73 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar227;
        bVar76 = (bool)(bVar73 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar228;
        auVar135._28_4_ =
             (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar125._28_4_;
        auVar122 = vminps_avx512vl(auVar122,auVar135);
        auVar80 = vxorps_avx512vl(auVar124._0_16_,auVar124._0_16_);
        auVar113 = vsubps_avx512vl(ZEXT1632(auVar80),auVar113);
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar80),auVar114);
        auVar123 = ZEXT1632(auVar80);
        auVar115 = vsubps_avx512vl(auVar123,auVar115);
        auVar115 = vmulps_avx512vl(auVar115,auVar112);
        auVar114 = vfmadd231ps_avx512vl(auVar115,auVar121,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar114,auVar117,auVar113);
        auVar112 = vmulps_avx512vl(local_600,auVar112);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_4a0,auVar121);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_5e0,auVar117);
        vandps_avx512vl(auVar112,auVar118);
        uVar18 = vcmpps_avx512vl(auVar112,auVar119,1);
        auVar113 = vxorps_avx512vl(auVar113,auVar92);
        auVar114 = vrcp14ps_avx512vl(auVar112);
        auVar92 = vxorps_avx512vl(auVar112,auVar92);
        auVar259 = ZEXT3264(auVar92);
        auVar115 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar108);
        auVar80 = vfmadd132ps_fma(auVar115,auVar114,auVar114);
        fVar246 = auVar80._0_4_ * auVar113._0_4_;
        fVar251 = auVar80._4_4_ * auVar113._4_4_;
        auVar46._4_4_ = fVar251;
        auVar46._0_4_ = fVar246;
        fVar252 = auVar80._8_4_ * auVar113._8_4_;
        auVar46._8_4_ = fVar252;
        fVar253 = auVar80._12_4_ * auVar113._12_4_;
        auVar46._12_4_ = fVar253;
        fVar226 = auVar113._16_4_ * 0.0;
        auVar46._16_4_ = fVar226;
        fVar227 = auVar113._20_4_ * 0.0;
        auVar46._20_4_ = fVar227;
        fVar228 = auVar113._24_4_ * 0.0;
        auVar46._24_4_ = fVar228;
        auVar46._28_4_ = auVar113._28_4_;
        uVar21 = vcmpps_avx512vl(auVar112,auVar92,1);
        bVar73 = (byte)uVar18 | (byte)uVar21;
        auVar30._8_4_ = 0xff800000;
        auVar30._0_8_ = 0xff800000ff800000;
        auVar30._12_4_ = 0xff800000;
        auVar30._16_4_ = 0xff800000;
        auVar30._20_4_ = 0xff800000;
        auVar30._24_4_ = 0xff800000;
        auVar30._28_4_ = 0xff800000;
        auVar115 = vblendmps_avx512vl(auVar46,auVar30);
        auVar136._0_4_ =
             (uint)(bVar73 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar114._0_4_;
        bVar76 = (bool)(bVar73 >> 1 & 1);
        auVar136._4_4_ = (uint)bVar76 * auVar115._4_4_ | (uint)!bVar76 * auVar114._4_4_;
        bVar76 = (bool)(bVar73 >> 2 & 1);
        auVar136._8_4_ = (uint)bVar76 * auVar115._8_4_ | (uint)!bVar76 * auVar114._8_4_;
        bVar76 = (bool)(bVar73 >> 3 & 1);
        auVar136._12_4_ = (uint)bVar76 * auVar115._12_4_ | (uint)!bVar76 * auVar114._12_4_;
        bVar76 = (bool)(bVar73 >> 4 & 1);
        auVar136._16_4_ = (uint)bVar76 * auVar115._16_4_ | (uint)!bVar76 * auVar114._16_4_;
        bVar76 = (bool)(bVar73 >> 5 & 1);
        auVar136._20_4_ = (uint)bVar76 * auVar115._20_4_ | (uint)!bVar76 * auVar114._20_4_;
        bVar76 = (bool)(bVar73 >> 6 & 1);
        auVar136._24_4_ = (uint)bVar76 * auVar115._24_4_ | (uint)!bVar76 * auVar114._24_4_;
        auVar136._28_4_ =
             (uint)(bVar73 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar114._28_4_;
        local_5c0 = vmaxps_avx(auVar126,auVar136);
        auVar257 = ZEXT3264(local_5c0);
        uVar21 = vcmpps_avx512vl(auVar112,auVar92,6);
        bVar73 = (byte)uVar18 | (byte)uVar21;
        auVar137._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * (int)fVar246;
        bVar76 = (bool)(bVar73 >> 1 & 1);
        auVar137._4_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar251;
        bVar76 = (bool)(bVar73 >> 2 & 1);
        auVar137._8_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar252;
        bVar76 = (bool)(bVar73 >> 3 & 1);
        auVar137._12_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar253;
        bVar76 = (bool)(bVar73 >> 4 & 1);
        auVar137._16_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar226;
        bVar76 = (bool)(bVar73 >> 5 & 1);
        auVar137._20_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar227;
        bVar76 = (bool)(bVar73 >> 6 & 1);
        auVar137._24_4_ = (uint)bVar76 * 0x7f800000 | (uint)!bVar76 * (int)fVar228;
        auVar137._28_4_ =
             (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar113._28_4_;
        local_340 = vminps_avx(auVar122,auVar137);
        auVar255 = ZEXT3264(local_340);
        uVar18 = vcmpps_avx512vl(local_5c0,local_340,2);
        bVar67 = bVar67 & 0x7f & (byte)uVar18;
        if (bVar67 == 0) goto LAB_01a9f312;
        auVar92 = vmaxps_avx512vl(auVar123,auVar91);
        auVar91 = vfmadd213ps_avx512vl(local_620,auVar128,auVar120);
        fVar246 = auVar116._0_4_;
        fVar251 = auVar116._4_4_;
        auVar47._4_4_ = fVar251 * auVar91._4_4_;
        auVar47._0_4_ = fVar246 * auVar91._0_4_;
        fVar252 = auVar116._8_4_;
        auVar47._8_4_ = fVar252 * auVar91._8_4_;
        fVar253 = auVar116._12_4_;
        auVar47._12_4_ = fVar253 * auVar91._12_4_;
        fVar226 = auVar116._16_4_;
        auVar47._16_4_ = fVar226 * auVar91._16_4_;
        fVar227 = auVar116._20_4_;
        auVar47._20_4_ = fVar227 * auVar91._20_4_;
        fVar228 = auVar116._24_4_;
        auVar47._24_4_ = fVar228 * auVar91._24_4_;
        auVar47._28_4_ = auVar91._28_4_;
        auVar91 = vfmadd213ps_avx512vl(local_660,auVar128,auVar120);
        auVar48._4_4_ = fVar251 * auVar91._4_4_;
        auVar48._0_4_ = fVar246 * auVar91._0_4_;
        auVar48._8_4_ = fVar252 * auVar91._8_4_;
        auVar48._12_4_ = fVar253 * auVar91._12_4_;
        auVar48._16_4_ = fVar226 * auVar91._16_4_;
        auVar48._20_4_ = fVar227 * auVar91._20_4_;
        auVar48._24_4_ = fVar228 * auVar91._24_4_;
        auVar48._28_4_ = auVar91._28_4_;
        auVar91 = vminps_avx512vl(auVar47,auVar108);
        auVar54 = ZEXT812(0);
        auVar112 = ZEXT1232(auVar54) << 0x20;
        auVar91 = vmaxps_avx(auVar91,ZEXT1232(auVar54) << 0x20);
        auVar113 = vminps_avx512vl(auVar48,auVar108);
        auVar49._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar91._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar49,auVar158,local_860);
        auVar91 = vmaxps_avx(auVar113,ZEXT1232(auVar54) << 0x20);
        auVar50._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar91._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar50,auVar158,local_860);
        auVar51._4_4_ = auVar92._4_4_ * auVar92._4_4_;
        auVar51._0_4_ = auVar92._0_4_ * auVar92._0_4_;
        auVar51._8_4_ = auVar92._8_4_ * auVar92._8_4_;
        auVar51._12_4_ = auVar92._12_4_ * auVar92._12_4_;
        auVar51._16_4_ = auVar92._16_4_ * auVar92._16_4_;
        auVar51._20_4_ = auVar92._20_4_ * auVar92._20_4_;
        auVar51._24_4_ = auVar92._24_4_ * auVar92._24_4_;
        auVar51._28_4_ = auVar92._28_4_;
        auVar91 = vsubps_avx(local_800,auVar51);
        auVar264 = ZEXT3264(auVar91);
        auVar52._4_4_ = auVar91._4_4_ * (float)local_880._4_4_;
        auVar52._0_4_ = auVar91._0_4_ * (float)local_880._0_4_;
        auVar52._8_4_ = auVar91._8_4_ * fStack_878;
        auVar52._12_4_ = auVar91._12_4_ * fStack_874;
        auVar52._16_4_ = auVar91._16_4_ * fStack_870;
        auVar52._20_4_ = auVar91._20_4_ * fStack_86c;
        auVar52._24_4_ = auVar91._24_4_ * fStack_868;
        auVar52._28_4_ = auVar92._28_4_;
        auVar92 = vsubps_avx(local_740,auVar52);
        uVar18 = vcmpps_avx512vl(auVar92,ZEXT1232(auVar54) << 0x20,5);
        bVar73 = (byte)uVar18;
        if (bVar73 == 0) {
          bVar73 = 0;
          auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar92 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar257 = ZEXT864(0) << 0x20;
          auVar138._8_4_ = 0x7f800000;
          auVar138._0_8_ = 0x7f8000007f800000;
          auVar138._12_4_ = 0x7f800000;
          auVar138._16_4_ = 0x7f800000;
          auVar138._20_4_ = 0x7f800000;
          auVar138._24_4_ = 0x7f800000;
          auVar138._28_4_ = 0x7f800000;
          auVar139._8_4_ = 0xff800000;
          auVar139._0_8_ = 0xff800000ff800000;
          auVar139._12_4_ = 0xff800000;
          auVar139._16_4_ = 0xff800000;
          auVar139._20_4_ = 0xff800000;
          auVar139._24_4_ = 0xff800000;
          auVar139._28_4_ = 0xff800000;
        }
        else {
          uVar74 = vcmpps_avx512vl(auVar92,auVar123,5);
          auVar92 = vsqrtps_avx(auVar92);
          auVar108 = vfnmadd213ps_avx512vl(auVar127,local_8a0,auVar108);
          auVar112 = vfmadd132ps_avx512vl(auVar108,local_8a0,local_8a0);
          auVar108 = vsubps_avx(_local_640,auVar92);
          auVar114 = vmulps_avx512vl(auVar108,auVar112);
          auVar92 = vsubps_avx512vl(auVar92,auVar129);
          auVar115 = vmulps_avx512vl(auVar92,auVar112);
          auVar92 = vfmadd213ps_avx512vl(auVar128,auVar114,auVar120);
          auVar53._4_4_ = fVar251 * auVar92._4_4_;
          auVar53._0_4_ = fVar246 * auVar92._0_4_;
          auVar53._8_4_ = fVar252 * auVar92._8_4_;
          auVar53._12_4_ = fVar253 * auVar92._12_4_;
          auVar53._16_4_ = fVar226 * auVar92._16_4_;
          auVar53._20_4_ = fVar227 * auVar92._20_4_;
          auVar53._24_4_ = fVar228 * auVar92._24_4_;
          auVar53._28_4_ = auVar113._28_4_;
          auVar92 = vmulps_avx512vl(local_5e0,auVar114);
          auVar108 = vmulps_avx512vl(local_4a0,auVar114);
          auVar112 = vmulps_avx512vl(local_600,auVar114);
          auVar113 = vfmadd213ps_avx512vl(auVar105,auVar53,auVar109);
          auVar92 = vsubps_avx512vl(auVar92,auVar113);
          auVar113 = vfmadd213ps_avx512vl(auVar106,auVar53,auVar110);
          auVar108 = vsubps_avx512vl(auVar108,auVar113);
          auVar80 = vfmadd213ps_fma(auVar53,auVar107,auVar111);
          auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar80));
          auVar257 = ZEXT3264(auVar112);
          auVar112 = vfmadd213ps_avx512vl(auVar128,auVar115,auVar120);
          auVar113 = vmulps_avx512vl(auVar116,auVar112);
          auVar112 = vmulps_avx512vl(local_5e0,auVar115);
          auVar116 = vmulps_avx512vl(local_4a0,auVar115);
          auVar117 = vmulps_avx512vl(local_600,auVar115);
          auVar80 = vfmadd213ps_fma(auVar105,auVar113,auVar109);
          auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar106,auVar113,auVar110);
          auVar105 = vsubps_avx512vl(auVar116,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar107,auVar113,auVar111);
          auVar106 = vsubps_avx512vl(auVar117,ZEXT1632(auVar80));
          auVar159._8_4_ = 0x7f800000;
          auVar159._0_8_ = 0x7f8000007f800000;
          auVar159._12_4_ = 0x7f800000;
          auVar159._16_4_ = 0x7f800000;
          auVar159._20_4_ = 0x7f800000;
          auVar159._24_4_ = 0x7f800000;
          auVar159._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar159,auVar114);
          bVar76 = (bool)((byte)uVar74 & 1);
          auVar138._0_4_ = (uint)bVar76 * auVar107._0_4_ | (uint)!bVar76 * auVar109._0_4_;
          bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar76 * auVar107._4_4_ | (uint)!bVar76 * auVar109._4_4_;
          bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar76 * auVar107._8_4_ | (uint)!bVar76 * auVar109._8_4_;
          bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar76 * auVar107._12_4_ | (uint)!bVar76 * auVar109._12_4_;
          bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar138._16_4_ = (uint)bVar76 * auVar107._16_4_ | (uint)!bVar76 * auVar109._16_4_;
          bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar138._20_4_ = (uint)bVar76 * auVar107._20_4_ | (uint)!bVar76 * auVar109._20_4_;
          bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar138._24_4_ = (uint)bVar76 * auVar107._24_4_ | (uint)!bVar76 * auVar109._24_4_;
          bVar76 = SUB81(uVar74 >> 7,0);
          auVar138._28_4_ = (uint)bVar76 * auVar107._28_4_ | (uint)!bVar76 * auVar109._28_4_;
          auVar160._8_4_ = 0xff800000;
          auVar160._0_8_ = 0xff800000ff800000;
          auVar160._12_4_ = 0xff800000;
          auVar160._16_4_ = 0xff800000;
          auVar160._20_4_ = 0xff800000;
          auVar160._24_4_ = 0xff800000;
          auVar160._28_4_ = 0xff800000;
          auVar107 = vblendmps_avx512vl(auVar160,auVar115);
          bVar76 = (bool)((byte)uVar74 & 1);
          auVar139._0_4_ = (uint)bVar76 * auVar107._0_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar76 * auVar107._4_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar76 * auVar107._8_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar76 * auVar107._12_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar76 * auVar107._16_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar76 * auVar107._20_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar76 * auVar107._24_4_ | (uint)!bVar76 * -0x800000;
          bVar76 = SUB81(uVar74 >> 7,0);
          auVar139._28_4_ = (uint)bVar76 * auVar107._28_4_ | (uint)!bVar76 * -0x800000;
          auVar31._8_4_ = 0x36000000;
          auVar31._0_8_ = 0x3600000036000000;
          auVar31._12_4_ = 0x36000000;
          auVar31._16_4_ = 0x36000000;
          auVar31._20_4_ = 0x36000000;
          auVar31._24_4_ = 0x36000000;
          auVar31._28_4_ = 0x36000000;
          auVar107 = vmulps_avx512vl(local_680,auVar31);
          uVar19 = vcmpps_avx512vl(auVar107,local_6a0,0xe);
          uVar74 = uVar74 & uVar19;
          bVar71 = (byte)uVar74;
          if (bVar71 != 0) {
            uVar19 = vcmpps_avx512vl(auVar91,_DAT_01f7b000,2);
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar263._8_4_ = 0xff800000;
            auVar263._0_8_ = 0xff800000ff800000;
            auVar263._12_4_ = 0xff800000;
            auVar263._16_4_ = 0xff800000;
            auVar263._20_4_ = 0xff800000;
            auVar263._24_4_ = 0xff800000;
            auVar263._28_4_ = 0xff800000;
            auVar264 = ZEXT3264(auVar263);
            auVar91 = vblendmps_avx512vl(auVar249,auVar263);
            bVar68 = (byte)uVar19;
            uVar77 = (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar107._0_4_
            ;
            bVar76 = (bool)((byte)(uVar19 >> 1) & 1);
            uVar143 = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar107._4_4_;
            bVar76 = (bool)((byte)(uVar19 >> 2) & 1);
            uVar144 = (uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar107._8_4_;
            bVar76 = (bool)((byte)(uVar19 >> 3) & 1);
            uVar145 = (uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar107._12_4_;
            bVar76 = (bool)((byte)(uVar19 >> 4) & 1);
            uVar146 = (uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * auVar107._16_4_;
            bVar76 = (bool)((byte)(uVar19 >> 5) & 1);
            uVar147 = (uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * auVar107._20_4_;
            bVar76 = (bool)((byte)(uVar19 >> 6) & 1);
            uVar148 = (uint)bVar76 * auVar91._24_4_ | (uint)!bVar76 * auVar107._24_4_;
            bVar76 = SUB81(uVar19 >> 7,0);
            uVar149 = (uint)bVar76 * auVar91._28_4_ | (uint)!bVar76 * auVar107._28_4_;
            auVar138._0_4_ = (bVar71 & 1) * uVar77 | !(bool)(bVar71 & 1) * auVar138._0_4_;
            bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar138._4_4_ = bVar76 * uVar143 | !bVar76 * auVar138._4_4_;
            bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar138._8_4_ = bVar76 * uVar144 | !bVar76 * auVar138._8_4_;
            bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar138._12_4_ = bVar76 * uVar145 | !bVar76 * auVar138._12_4_;
            bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar138._16_4_ = bVar76 * uVar146 | !bVar76 * auVar138._16_4_;
            bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar138._20_4_ = bVar76 * uVar147 | !bVar76 * auVar138._20_4_;
            bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar138._24_4_ = bVar76 * uVar148 | !bVar76 * auVar138._24_4_;
            bVar76 = SUB81(uVar74 >> 7,0);
            auVar138._28_4_ = bVar76 * uVar149 | !bVar76 * auVar138._28_4_;
            auVar91 = vblendmps_avx512vl(auVar263,auVar249);
            bVar76 = (bool)((byte)(uVar19 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar19 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar19 >> 6) & 1);
            bVar13 = SUB81(uVar19 >> 7,0);
            auVar139._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar68 & 1) * auVar91._0_4_ | !(bool)(bVar68 & 1) * uVar77) |
                 !(bool)(bVar71 & 1) * auVar139._0_4_;
            bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar139._4_4_ =
                 (uint)bVar7 * ((uint)bVar76 * auVar91._4_4_ | !bVar76 * uVar143) |
                 !bVar7 * auVar139._4_4_;
            bVar76 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar139._8_4_ =
                 (uint)bVar76 * ((uint)bVar8 * auVar91._8_4_ | !bVar8 * uVar144) |
                 !bVar76 * auVar139._8_4_;
            bVar76 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar139._12_4_ =
                 (uint)bVar76 * ((uint)bVar9 * auVar91._12_4_ | !bVar9 * uVar145) |
                 !bVar76 * auVar139._12_4_;
            bVar76 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar139._16_4_ =
                 (uint)bVar76 * ((uint)bVar10 * auVar91._16_4_ | !bVar10 * uVar146) |
                 !bVar76 * auVar139._16_4_;
            bVar76 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar139._20_4_ =
                 (uint)bVar76 * ((uint)bVar11 * auVar91._20_4_ | !bVar11 * uVar147) |
                 !bVar76 * auVar139._20_4_;
            bVar76 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar139._24_4_ =
                 (uint)bVar76 * ((uint)bVar12 * auVar91._24_4_ | !bVar12 * uVar148) |
                 !bVar76 * auVar139._24_4_;
            bVar76 = SUB81(uVar74 >> 7,0);
            auVar139._28_4_ =
                 (uint)bVar76 * ((uint)bVar13 * auVar91._28_4_ | !bVar13 * uVar149) |
                 !bVar76 * auVar139._28_4_;
            bVar73 = (~bVar71 | bVar68) & bVar73;
          }
        }
        auVar91 = vmulps_avx512vl(local_600,auVar106);
        auVar91 = vfmadd231ps_avx512vl(auVar91,local_4a0,auVar105);
        auVar250 = ZEXT3264(local_4a0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,local_5e0,auVar112);
        auVar259 = ZEXT3264(local_5c0);
        _local_200 = local_5c0;
        local_1e0 = vminps_avx(local_340,auVar138);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(auVar91,auVar243);
        _local_580 = vmaxps_avx(local_5c0,auVar139);
        _local_360 = _local_580;
        auVar244._8_4_ = 0x3e99999a;
        auVar244._0_8_ = 0x3e99999a3e99999a;
        auVar244._12_4_ = 0x3e99999a;
        auVar244._16_4_ = 0x3e99999a;
        auVar244._20_4_ = 0x3e99999a;
        auVar244._24_4_ = 0x3e99999a;
        auVar244._28_4_ = 0x3e99999a;
        auVar245 = ZEXT3264(auVar244);
        uVar18 = vcmpps_avx512vl(auVar91,auVar244,1);
        uVar21 = vcmpps_avx512vl(local_5c0,local_1e0,2);
        bVar71 = (byte)uVar21 & bVar67;
        uVar20 = vcmpps_avx512vl(_local_580,local_340,2);
        if ((bVar67 & ((byte)uVar20 | (byte)uVar21)) == 0) {
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar266 = ZEXT3264(auVar91);
          auVar239 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar68 = (byte)uVar18 | ~bVar73;
          auVar91 = vmulps_avx512vl(local_600,auVar257._0_32_);
          auVar80 = vfmadd213ps_fma(auVar108,local_4a0,auVar91);
          auVar91 = vfmadd213ps_avx512vl(auVar92,local_5e0,ZEXT1632(auVar80));
          auVar91 = vandps_avx(auVar91,auVar243);
          uVar18 = vcmpps_avx512vl(auVar91,auVar244,1);
          bVar73 = (byte)uVar18 | ~bVar73;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar161,auVar32);
          local_320._0_4_ = (uint)(bVar73 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar76 = (bool)(bVar73 >> 1 & 1);
          local_320._4_4_ = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar73 >> 2 & 1);
          local_320._8_4_ = (uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar73 >> 3 & 1);
          local_320._12_4_ = (uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar73 >> 4 & 1);
          local_320._16_4_ = (uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar73 >> 5 & 1);
          local_320._20_4_ = (uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar73 >> 6 & 1);
          local_320._24_4_ = (uint)bVar76 * auVar91._24_4_ | (uint)!bVar76 * 2;
          local_320._28_4_ = (uint)(bVar73 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar18 = vpcmpd_avx512vl(local_500,local_320,5);
          local_560 = local_5c0._0_4_ + (float)local_5a0._0_4_;
          fStack_55c = local_5c0._4_4_ + (float)local_5a0._4_4_;
          fStack_558 = local_5c0._8_4_ + fStack_598;
          fStack_554 = local_5c0._12_4_ + fStack_594;
          fStack_550 = local_5c0._16_4_ + fStack_590;
          fStack_54c = local_5c0._20_4_ + fStack_58c;
          fStack_548 = local_5c0._24_4_ + fStack_588;
          fStack_544 = local_5c0._28_4_ + fStack_584;
          for (bVar73 = (byte)uVar18 & bVar71; bVar73 != 0;
              bVar73 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar73 & (byte)uVar18) {
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar162,local_5c0);
            auVar140._0_4_ =
                 (uint)(bVar73 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 3 & 1);
            auVar140._12_4_ = (uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 4 & 1);
            auVar140._16_4_ = (uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 5 & 1);
            auVar140._20_4_ = (uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * 0x7f800000;
            auVar140._24_4_ =
                 (uint)(bVar73 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar140,auVar140,0xb1);
            auVar91 = vminps_avx(auVar140,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar18 = vcmpps_avx512vl(auVar140,auVar91,0);
            bVar69 = (byte)uVar18 & bVar73;
            bVar70 = bVar73;
            if (bVar69 != 0) {
              bVar70 = bVar69;
            }
            iVar22 = 0;
            for (uVar77 = (uint)bVar70; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar77 = *(uint *)(local_200 + (uint)(iVar22 << 2));
            fVar246 = auVar15._0_4_;
            auVar80 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
            if ((float)local_7e0._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
              auVar250 = ZEXT1664(auVar250._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              fVar246 = sqrtf((float)local_7e0._0_4_);
              auVar80 = local_860._0_16_;
            }
            auVar245 = ZEXT464(uVar77);
            auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar90 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar86 = vminps_avx(auVar78,auVar90);
            auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar90 = vmaxps_avx(auVar85,auVar78);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar86,auVar209);
            auVar78 = vandps_avx(auVar90,auVar209);
            auVar85 = vmaxps_avx(auVar85,auVar78);
            auVar78 = vmovshdup_avx(auVar85);
            auVar78 = vmaxss_avx(auVar78,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar78);
            fVar251 = auVar85._0_4_ * 1.9073486e-06;
            local_840._0_4_ = fVar246 * 1.9073486e-06;
            local_6f0 = vshufps_avx(auVar90,auVar90,0xff);
            auVar80 = vinsertps_avx(ZEXT416(uVar77),auVar80,0x10);
            auVar255 = ZEXT1664(auVar80);
            lVar75 = 5;
            do {
              do {
                bVar76 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                if (bVar76) goto LAB_01a9febb;
                uVar173 = auVar255._0_4_;
                auVar152._4_4_ = uVar173;
                auVar152._0_4_ = uVar173;
                auVar152._8_4_ = uVar173;
                auVar152._12_4_ = uVar173;
                auVar80 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_7d0);
                local_740 = auVar255._0_32_;
                auVar85 = vmovshdup_avx(auVar255._0_16_);
                fVar226 = auVar85._0_4_;
                fVar208 = 1.0 - fVar226;
                fVar253 = fVar208 * fVar208 * fVar208;
                fVar246 = fVar226 * fVar226;
                fVar228 = fVar226 * fVar246;
                auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                          ZEXT416((uint)fVar228));
                fVar252 = fVar226 * fVar208;
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar252 * 6.0)),
                                          ZEXT416((uint)(fVar208 * fVar252)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                          ZEXT416((uint)fVar253));
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar252 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar226 * fVar252)));
                fVar253 = fVar253 * 0.16666667;
                fVar226 = (auVar78._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar227 = (auVar90._0_4_ + auVar79._0_4_) * 0.16666667;
                fVar228 = fVar228 * 0.16666667;
                auVar191._0_4_ = fVar228 * (float)local_7c0._0_4_;
                auVar191._4_4_ = fVar228 * (float)local_7c0._4_4_;
                auVar191._8_4_ = fVar228 * fStack_7b8;
                auVar191._12_4_ = fVar228 * fStack_7b4;
                auVar229._4_4_ = fVar227;
                auVar229._0_4_ = fVar227;
                auVar229._8_4_ = fVar227;
                auVar229._12_4_ = fVar227;
                auVar78 = vfmadd132ps_fma(auVar229,auVar191,local_780._0_16_);
                auVar192._4_4_ = fVar226;
                auVar192._0_4_ = fVar226;
                auVar192._8_4_ = fVar226;
                auVar192._12_4_ = fVar226;
                auVar78 = vfmadd132ps_fma(auVar192,auVar78,local_7a0._0_16_);
                auVar174._4_4_ = fVar253;
                auVar174._0_4_ = fVar253;
                auVar174._8_4_ = fVar253;
                auVar174._12_4_ = fVar253;
                auVar78 = vfmadd132ps_fma(auVar174,auVar78,local_760._0_16_);
                local_620._0_16_ = auVar78;
                auVar78 = vsubps_avx(auVar80,auVar78);
                auVar80 = vdpps_avx(auVar78,auVar78,0x7f);
                local_800._0_16_ = auVar80;
                local_860._0_16_ = ZEXT416((uint)fVar208);
                if (auVar80._0_4_ < 0.0) {
                  local_880._0_4_ = fVar246;
                  local_8a0._0_4_ = fVar252;
                  auVar245._0_4_ = sqrtf(auVar80._0_4_);
                  auVar245._4_60_ = extraout_var;
                  auVar80 = auVar245._0_16_;
                  fVar252 = (float)local_8a0._0_4_;
                  auVar90 = local_860._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  local_880._0_4_ = fVar246;
                  auVar90 = ZEXT416((uint)fVar208);
                }
                local_640._4_4_ = auVar90._0_4_;
                local_640._0_4_ = local_640._4_4_;
                fStack_638 = (float)local_640._4_4_;
                fStack_634 = (float)local_640._4_4_;
                auVar86 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar252 * 4.0)));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * 4.0)),auVar90,auVar90);
                fVar246 = (float)local_640._4_4_ * -(float)local_640._4_4_ * 0.5;
                fVar252 = auVar86._0_4_ * 0.5;
                fVar253 = auVar90._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar210._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar210._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar210._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar210._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar175._4_4_ = fVar253;
                auVar175._0_4_ = fVar253;
                auVar175._8_4_ = fVar253;
                auVar175._12_4_ = fVar253;
                auVar90 = vfmadd132ps_fma(auVar175,auVar210,local_780._0_16_);
                auVar193._4_4_ = fVar252;
                auVar193._0_4_ = fVar252;
                auVar193._8_4_ = fVar252;
                auVar193._12_4_ = fVar252;
                auVar90 = vfmadd132ps_fma(auVar193,auVar90,local_7a0._0_16_);
                auVar260._4_4_ = fVar246;
                auVar260._0_4_ = fVar246;
                auVar260._8_4_ = fVar246;
                auVar260._12_4_ = fVar246;
                _local_880 = vfmadd132ps_fma(auVar260,auVar90,local_760._0_16_);
                local_660._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar55._12_4_ = 0;
                auVar55._0_12_ = ZEXT812(0);
                fVar246 = local_660._0_4_;
                local_830 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar246));
                fVar252 = local_830._0_4_;
                local_680._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar246));
                auVar90 = vfnmadd213ss_fma(local_680._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_6a0._0_4_ = auVar90._0_4_;
                local_8a0._0_4_ = auVar80._0_4_;
                if (fVar246 < -fVar246) {
                  fVar253 = sqrtf(fVar246);
                  auVar80 = ZEXT416((uint)local_8a0._0_4_);
                  auVar90 = _local_880;
                }
                else {
                  auVar90 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                  fVar253 = auVar90._0_4_;
                  auVar90 = _local_880;
                }
                fVar226 = local_830._0_4_;
                fVar246 = fVar252 * 1.5 + fVar246 * -0.5 * fVar226 * fVar226 * fVar226;
                local_830._0_4_ = auVar90._0_4_ * fVar246;
                local_830._4_4_ = auVar90._4_4_ * fVar246;
                local_830._8_4_ = auVar90._8_4_ * fVar246;
                local_830._12_4_ = auVar90._12_4_ * fVar246;
                auVar86 = vdpps_avx(auVar78,local_830,0x7f);
                fVar227 = auVar80._0_4_;
                fVar252 = auVar86._0_4_;
                auVar153._0_4_ = fVar252 * fVar252;
                auVar153._4_4_ = auVar86._4_4_ * auVar86._4_4_;
                auVar153._8_4_ = auVar86._8_4_ * auVar86._8_4_;
                auVar153._12_4_ = auVar86._12_4_ * auVar86._12_4_;
                auVar79 = vsubps_avx(local_800._0_16_,auVar153);
                fVar226 = auVar79._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar226;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar82 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar83 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
                if (fVar226 < 0.0) {
                  local_6b0._0_4_ = fVar253;
                  local_6d0._0_4_ = auVar82._0_4_;
                  local_6e0._4_4_ = fVar246;
                  local_6e0._0_4_ = fVar246;
                  fStack_6d8 = fVar246;
                  fStack_6d4 = fVar246;
                  local_6c0 = auVar81;
                  fVar226 = sqrtf(fVar226);
                  auVar83 = ZEXT416(auVar83._0_4_);
                  auVar82 = ZEXT416((uint)local_6d0._0_4_);
                  auVar80 = ZEXT416((uint)local_8a0._0_4_);
                  auVar81 = local_6c0;
                  auVar90 = _local_880;
                  fVar246 = (float)local_6e0._0_4_;
                  fVar228 = (float)local_6e0._4_4_;
                  fVar208 = fStack_6d8;
                  fVar265 = fStack_6d4;
                  fVar253 = (float)local_6b0._0_4_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar79,auVar79);
                  fVar226 = auVar79._0_4_;
                  fVar228 = fVar246;
                  fVar208 = fVar246;
                  fVar265 = fVar246;
                }
                auVar264 = ZEXT1664(auVar90);
                auVar259 = ZEXT1664(local_800._0_16_);
                auVar257 = ZEXT1664(auVar78);
                auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar85);
                auVar87 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar89 = local_740._0_16_;
                auVar85 = vshufps_avx(auVar89,auVar89,0x55);
                auVar194._0_4_ = auVar85._0_4_ * (float)local_7c0._0_4_;
                auVar194._4_4_ = auVar85._4_4_ * (float)local_7c0._4_4_;
                auVar194._8_4_ = auVar85._8_4_ * fStack_7b8;
                auVar194._12_4_ = auVar85._12_4_ * fStack_7b4;
                auVar211._0_4_ = auVar87._0_4_;
                auVar211._4_4_ = auVar211._0_4_;
                auVar211._8_4_ = auVar211._0_4_;
                auVar211._12_4_ = auVar211._0_4_;
                auVar85 = vfmadd132ps_fma(auVar211,auVar194,local_780._0_16_);
                auVar177._0_4_ = auVar79._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar85 = vfmadd132ps_fma(auVar177,auVar85,local_7a0._0_16_);
                auVar85 = vfmadd132ps_fma(_local_640,auVar85,local_760._0_16_);
                auVar178._0_4_ = auVar85._0_4_ * (float)local_660._0_4_;
                auVar178._4_4_ = auVar85._4_4_ * (float)local_660._0_4_;
                auVar178._8_4_ = auVar85._8_4_ * (float)local_660._0_4_;
                auVar178._12_4_ = auVar85._12_4_ * (float)local_660._0_4_;
                auVar85 = vdpps_avx(auVar90,auVar85,0x7f);
                fVar190 = auVar85._0_4_;
                auVar195._0_4_ = auVar90._0_4_ * fVar190;
                auVar195._4_4_ = auVar90._4_4_ * fVar190;
                auVar195._8_4_ = auVar90._8_4_ * fVar190;
                auVar195._12_4_ = auVar90._12_4_ * fVar190;
                auVar85 = vsubps_avx(auVar178,auVar195);
                fVar190 = (float)local_6a0._0_4_ * (float)local_680._0_4_;
                auVar87 = vmaxss_avx(ZEXT416((uint)fVar251),
                                     ZEXT416((uint)(local_740._0_4_ * (float)local_840._0_4_)));
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar84 = vxorps_avx512vl(auVar90,auVar23);
                auVar196._0_4_ = fVar246 * auVar85._0_4_ * fVar190;
                auVar196._4_4_ = fVar228 * auVar85._4_4_ * fVar190;
                auVar196._8_4_ = fVar208 * auVar85._8_4_ * fVar190;
                auVar196._12_4_ = fVar265 * auVar85._12_4_ * fVar190;
                auVar85 = vdpps_avx(auVar84,local_830,0x7f);
                auVar79 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar251),auVar87);
                auVar80 = vdpps_avx(auVar78,auVar196,0x7f);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                          ZEXT416((uint)(fVar251 / fVar253)),auVar79);
                fVar246 = auVar85._0_4_ + auVar80._0_4_;
                auVar80 = vdpps_avx(local_7d0,local_830,0x7f);
                auVar85 = vdpps_avx(auVar78,auVar84,0x7f);
                auVar79 = vmulss_avx512f(auVar83,auVar81);
                auVar83 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar79._0_4_ *
                                                               auVar81._0_4_ * auVar81._0_4_)));
                auVar79 = vdpps_avx(auVar78,local_7d0,0x7f);
                auVar82 = vfnmadd231ss_fma(auVar85,auVar86,ZEXT416((uint)fVar246));
                auVar79 = vfnmadd231ss_fma(auVar79,auVar86,auVar80);
                auVar85 = vpermilps_avx(local_620._0_16_,0xff);
                fVar226 = fVar226 - auVar85._0_4_;
                auVar81 = vshufps_avx(auVar90,auVar90,0xff);
                auVar85 = vfmsub213ss_fma(auVar82,auVar83,auVar81);
                auVar247._8_4_ = 0x80000000;
                auVar247._0_8_ = 0x8000000080000000;
                auVar247._12_4_ = 0x80000000;
                auVar250 = ZEXT1664(auVar247);
                auVar241._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar245 = ZEXT1664(auVar241);
                auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar83._0_4_));
                auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar246),auVar79);
                auVar85 = vinsertps_avx(auVar241,auVar79,0x1c);
                auVar235._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = auVar80._8_4_ ^ 0x80000000;
                auVar235._12_4_ = auVar80._12_4_ ^ 0x80000000;
                auVar79 = vinsertps_avx(ZEXT416((uint)fVar246),auVar235,0x10);
                auVar212._0_4_ = auVar82._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar80 = vdivps_avx(auVar85,auVar212);
                auVar85 = vdivps_avx(auVar79,auVar212);
                auVar213._0_4_ = fVar252 * auVar80._0_4_ + fVar226 * auVar85._0_4_;
                auVar213._4_4_ = fVar252 * auVar80._4_4_ + fVar226 * auVar85._4_4_;
                auVar213._8_4_ = fVar252 * auVar80._8_4_ + fVar226 * auVar85._8_4_;
                auVar213._12_4_ = fVar252 * auVar80._12_4_ + fVar226 * auVar85._12_4_;
                auVar80 = vsubps_avx(auVar89,auVar213);
                auVar255 = ZEXT1664(auVar80);
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar86,auVar24);
              } while (auVar88._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar87._0_4_)),local_6f0,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar86 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar25);
            } while (auVar85._0_4_ <= auVar86._0_4_);
            fVar246 = auVar80._0_4_ + (float)local_700._0_4_;
            if ((fVar150 <= fVar246) &&
               (fVar251 = *(float *)(ray + k * 4 + 0x100), fVar246 <= fVar251)) {
              auVar85 = vmovshdup_avx(auVar80);
              fVar252 = auVar85._0_4_;
              if ((0.0 <= fVar252) && (fVar252 <= 1.0)) {
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_800._0_4_));
                fVar253 = auVar85._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar1].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar253 = fVar253 * 1.5 + local_800._0_4_ * -0.5 * fVar253 * fVar253 * fVar253;
                  auVar214._0_4_ = auVar78._0_4_ * fVar253;
                  auVar214._4_4_ = auVar78._4_4_ * fVar253;
                  auVar214._8_4_ = auVar78._8_4_ * fVar253;
                  auVar214._12_4_ = auVar78._12_4_ * fVar253;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar214,auVar90);
                  auVar85 = vshufps_avx(auVar214,auVar214,0xc9);
                  auVar86 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar215._0_4_ = auVar214._0_4_ * auVar86._0_4_;
                  auVar215._4_4_ = auVar214._4_4_ * auVar86._4_4_;
                  auVar215._8_4_ = auVar214._8_4_ * auVar86._8_4_;
                  auVar215._12_4_ = auVar214._12_4_ * auVar86._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar215,auVar90,auVar85);
                  auVar85 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar86 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                  auVar154._0_4_ = auVar81._0_4_ * auVar79._0_4_;
                  auVar154._4_4_ = auVar81._4_4_ * auVar79._4_4_;
                  auVar154._8_4_ = auVar81._8_4_ * auVar79._8_4_;
                  auVar154._12_4_ = auVar81._12_4_ * auVar79._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar154,auVar85,auVar86);
                  uVar173 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                    uVar3 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar173;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar252;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar1;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar6 = context->user;
                    auVar223._8_4_ = 1;
                    auVar223._0_8_ = 0x100000001;
                    auVar223._12_4_ = 1;
                    auVar223._16_4_ = 1;
                    auVar223._20_4_ = 1;
                    auVar223._24_4_ = 1;
                    auVar223._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar223,ZEXT1632(auVar80));
                    auVar91 = vpermps_avx2(auVar223,ZEXT1632(auVar85));
                    auVar233._8_4_ = 2;
                    auVar233._0_8_ = 0x200000002;
                    auVar233._12_4_ = 2;
                    auVar233._16_4_ = 2;
                    auVar233._20_4_ = 2;
                    auVar233._24_4_ = 2;
                    auVar233._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar233,ZEXT1632(auVar85));
                    local_480[0] = (RTCHitN)auVar91[0];
                    local_480[1] = (RTCHitN)auVar91[1];
                    local_480[2] = (RTCHitN)auVar91[2];
                    local_480[3] = (RTCHitN)auVar91[3];
                    local_480[4] = (RTCHitN)auVar91[4];
                    local_480[5] = (RTCHitN)auVar91[5];
                    local_480[6] = (RTCHitN)auVar91[6];
                    local_480[7] = (RTCHitN)auVar91[7];
                    local_480[8] = (RTCHitN)auVar91[8];
                    local_480[9] = (RTCHitN)auVar91[9];
                    local_480[10] = (RTCHitN)auVar91[10];
                    local_480[0xb] = (RTCHitN)auVar91[0xb];
                    local_480[0xc] = (RTCHitN)auVar91[0xc];
                    local_480[0xd] = (RTCHitN)auVar91[0xd];
                    local_480[0xe] = (RTCHitN)auVar91[0xe];
                    local_480[0xf] = (RTCHitN)auVar91[0xf];
                    local_480[0x10] = (RTCHitN)auVar91[0x10];
                    local_480[0x11] = (RTCHitN)auVar91[0x11];
                    local_480[0x12] = (RTCHitN)auVar91[0x12];
                    local_480[0x13] = (RTCHitN)auVar91[0x13];
                    local_480[0x14] = (RTCHitN)auVar91[0x14];
                    local_480[0x15] = (RTCHitN)auVar91[0x15];
                    local_480[0x16] = (RTCHitN)auVar91[0x16];
                    local_480[0x17] = (RTCHitN)auVar91[0x17];
                    local_480[0x18] = (RTCHitN)auVar91[0x18];
                    local_480[0x19] = (RTCHitN)auVar91[0x19];
                    local_480[0x1a] = (RTCHitN)auVar91[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar91[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar91[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar91[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar91[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar91[0x1f];
                    local_440 = uVar173;
                    uStack_43c = uVar173;
                    uStack_438 = uVar173;
                    uStack_434 = uVar173;
                    uStack_430 = uVar173;
                    uStack_42c = uVar173;
                    uStack_428 = uVar173;
                    uStack_424 = uVar173;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar91 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_818[1] = auVar91;
                    *local_818 = auVar91;
                    local_3a0 = pRVar6->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar6->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                    local_720 = local_520;
                    local_8d0.valid = (int *)local_720;
                    local_8d0.geometryUserPtr = pGVar4->userPtr;
                    local_8d0.context = context->user;
                    local_8d0.hit = local_480;
                    local_8d0.N = 8;
                    local_8d0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar245 = ZEXT1664(auVar241);
                      auVar250 = ZEXT1664(auVar247);
                      auVar255 = ZEXT1664(auVar80);
                      auVar257 = ZEXT1664(auVar78);
                      auVar259 = ZEXT1664(local_800._0_16_);
                      auVar264 = ZEXT1664(auVar90);
                      (*pGVar4->intersectionFilterN)(&local_8d0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar245 = ZEXT1664(auVar245._0_16_);
                        auVar250 = ZEXT1664(auVar250._0_16_);
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        (*p_Var5)(&local_8d0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar74 = vptestmd_avx512vl(local_720,local_720);
                        iVar57 = *(int *)(local_8d0.hit + 4);
                        iVar58 = *(int *)(local_8d0.hit + 8);
                        iVar59 = *(int *)(local_8d0.hit + 0xc);
                        iVar60 = *(int *)(local_8d0.hit + 0x10);
                        iVar61 = *(int *)(local_8d0.hit + 0x14);
                        iVar62 = *(int *)(local_8d0.hit + 0x18);
                        iVar63 = *(int *)(local_8d0.hit + 0x1c);
                        bVar70 = (byte)uVar74;
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x180) =
                             (uint)(bVar70 & 1) * *(int *)local_8d0.hit |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_8d0.ray + 0x180);
                        *(uint *)(local_8d0.ray + 0x184) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x184)
                        ;
                        *(uint *)(local_8d0.ray + 0x188) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x188);
                        *(uint *)(local_8d0.ray + 0x18c) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x18c);
                        *(uint *)(local_8d0.ray + 400) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 400);
                        *(uint *)(local_8d0.ray + 0x194) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x194)
                        ;
                        *(uint *)(local_8d0.ray + 0x198) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x198)
                        ;
                        *(uint *)(local_8d0.ray + 0x19c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x19c)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x24);
                        iVar58 = *(int *)(local_8d0.hit + 0x28);
                        iVar59 = *(int *)(local_8d0.hit + 0x2c);
                        iVar60 = *(int *)(local_8d0.hit + 0x30);
                        iVar61 = *(int *)(local_8d0.hit + 0x34);
                        iVar62 = *(int *)(local_8d0.hit + 0x38);
                        iVar63 = *(int *)(local_8d0.hit + 0x3c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1a0) =
                             (uint)(bVar70 & 1) * *(int *)(local_8d0.hit + 0x20) |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                        *(uint *)(local_8d0.ray + 0x1a4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1a4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1a8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1a8);
                        *(uint *)(local_8d0.ray + 0x1ac) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1ac);
                        *(uint *)(local_8d0.ray + 0x1b0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1b0);
                        *(uint *)(local_8d0.ray + 0x1b4) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1bc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1bc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x44);
                        iVar58 = *(int *)(local_8d0.hit + 0x48);
                        iVar59 = *(int *)(local_8d0.hit + 0x4c);
                        iVar60 = *(int *)(local_8d0.hit + 0x50);
                        iVar61 = *(int *)(local_8d0.hit + 0x54);
                        iVar62 = *(int *)(local_8d0.hit + 0x58);
                        iVar63 = *(int *)(local_8d0.hit + 0x5c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1c0) =
                             (uint)(bVar70 & 1) * *(int *)(local_8d0.hit + 0x40) |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                        *(uint *)(local_8d0.ray + 0x1c4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1c4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1c8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1c8);
                        *(uint *)(local_8d0.ray + 0x1cc) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1cc);
                        *(uint *)(local_8d0.ray + 0x1d0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1d0);
                        *(uint *)(local_8d0.ray + 0x1d4) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1dc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1dc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 100);
                        iVar58 = *(int *)(local_8d0.hit + 0x68);
                        iVar59 = *(int *)(local_8d0.hit + 0x6c);
                        iVar60 = *(int *)(local_8d0.hit + 0x70);
                        iVar61 = *(int *)(local_8d0.hit + 0x74);
                        iVar62 = *(int *)(local_8d0.hit + 0x78);
                        iVar63 = *(int *)(local_8d0.hit + 0x7c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1e0) =
                             (uint)(bVar70 & 1) * *(int *)(local_8d0.hit + 0x60) |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                        *(uint *)(local_8d0.ray + 0x1e4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1e4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1e8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1e8);
                        *(uint *)(local_8d0.ray + 0x1ec) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1ec);
                        *(uint *)(local_8d0.ray + 0x1f0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1f0);
                        *(uint *)(local_8d0.ray + 500) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 500);
                        *(uint *)(local_8d0.ray + 0x1f8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1fc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1fc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x84);
                        iVar58 = *(int *)(local_8d0.hit + 0x88);
                        iVar59 = *(int *)(local_8d0.hit + 0x8c);
                        iVar60 = *(int *)(local_8d0.hit + 0x90);
                        iVar61 = *(int *)(local_8d0.hit + 0x94);
                        iVar62 = *(int *)(local_8d0.hit + 0x98);
                        iVar63 = *(int *)(local_8d0.hit + 0x9c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x200) =
                             (uint)(bVar70 & 1) * *(int *)(local_8d0.hit + 0x80) |
                             (uint)!(bool)(bVar70 & 1) * *(int *)(local_8d0.ray + 0x200);
                        *(uint *)(local_8d0.ray + 0x204) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x204)
                        ;
                        *(uint *)(local_8d0.ray + 0x208) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x208);
                        *(uint *)(local_8d0.ray + 0x20c) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x20c);
                        *(uint *)(local_8d0.ray + 0x210) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x210);
                        *(uint *)(local_8d0.ray + 0x214) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x214)
                        ;
                        *(uint *)(local_8d0.ray + 0x218) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x218)
                        ;
                        *(uint *)(local_8d0.ray + 0x21c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x21c)
                        ;
                        auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar91;
                        auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar91;
                        auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar91;
                        auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar91;
                        goto LAB_01a9febb;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar251;
                  }
                }
              }
            }
LAB_01a9febb:
            uVar173 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar237._4_4_ = uVar173;
            auVar237._0_4_ = uVar173;
            auVar237._8_4_ = uVar173;
            auVar237._12_4_ = uVar173;
            auVar237._16_4_ = uVar173;
            auVar237._20_4_ = uVar173;
            auVar237._24_4_ = uVar173;
            auVar237._28_4_ = uVar173;
            auVar239 = ZEXT3264(auVar237);
            auVar64._4_4_ = fStack_55c;
            auVar64._0_4_ = local_560;
            auVar64._8_4_ = fStack_558;
            auVar64._12_4_ = fStack_554;
            auVar64._16_4_ = fStack_550;
            auVar64._20_4_ = fStack_54c;
            auVar64._24_4_ = fStack_548;
            auVar64._28_4_ = fStack_544;
            uVar18 = vcmpps_avx512vl(auVar237,auVar64,0xd);
          }
          auVar163._0_4_ = (float)local_5a0._0_4_ + (float)local_580._0_4_;
          auVar163._4_4_ = (float)local_5a0._4_4_ + (float)local_580._4_4_;
          auVar163._8_4_ = fStack_598 + fStack_578;
          auVar163._12_4_ = fStack_594 + fStack_574;
          auVar163._16_4_ = fStack_590 + fStack_570;
          auVar163._20_4_ = fStack_58c + fStack_56c;
          auVar163._24_4_ = fStack_588 + fStack_568;
          auVar163._28_4_ = fStack_584 + fStack_564;
          uVar173 = auVar239._0_4_;
          auVar185._4_4_ = uVar173;
          auVar185._0_4_ = uVar173;
          auVar185._8_4_ = uVar173;
          auVar185._12_4_ = uVar173;
          auVar185._16_4_ = uVar173;
          auVar185._20_4_ = uVar173;
          auVar185._24_4_ = uVar173;
          auVar185._28_4_ = uVar173;
          uVar18 = vcmpps_avx512vl(auVar163,auVar185,2);
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar164,auVar33);
          local_580._0_4_ = (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * 2;
          bVar76 = (bool)(bVar68 >> 1 & 1);
          local_580._4_4_ = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * 2;
          bVar76 = (bool)(bVar68 >> 2 & 1);
          fStack_578 = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * 2);
          bVar76 = (bool)(bVar68 >> 3 & 1);
          fStack_574 = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * 2);
          bVar76 = (bool)(bVar68 >> 4 & 1);
          fStack_570 = (float)((uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * 2);
          bVar76 = (bool)(bVar68 >> 5 & 1);
          fStack_56c = (float)((uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * 2);
          bVar76 = (bool)(bVar68 >> 6 & 1);
          fStack_568 = (float)((uint)bVar76 * auVar91._24_4_ | (uint)!bVar76 * 2);
          fStack_564 = (float)((uint)(bVar68 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar68 >> 7) * 2
                              );
          bVar67 = (byte)uVar20 & bVar67 & (byte)uVar18;
          uVar18 = vpcmpd_avx512vl(_local_580,local_500,2);
          local_5c0 = _local_360;
          local_560 = (float)local_5a0._0_4_ + (float)local_360._0_4_;
          fStack_55c = (float)local_5a0._4_4_ + (float)local_360._4_4_;
          fStack_558 = fStack_598 + fStack_358;
          fStack_554 = fStack_594 + fStack_354;
          fStack_550 = fStack_590 + fStack_350;
          fStack_54c = fStack_58c + fStack_34c;
          fStack_548 = fStack_588 + fStack_348;
          fStack_544 = fStack_584 + fStack_344;
          for (bVar73 = (byte)uVar18 & bVar67; bVar73 != 0;
              bVar73 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar73 & (byte)uVar18) {
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar165,local_5c0);
            auVar141._0_4_ =
                 (uint)(bVar73 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 1 & 1);
            auVar141._4_4_ = (uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 2 & 1);
            auVar141._8_4_ = (uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 3 & 1);
            auVar141._12_4_ = (uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 4 & 1);
            auVar141._16_4_ = (uint)bVar76 * auVar91._16_4_ | (uint)!bVar76 * 0x7f800000;
            bVar76 = (bool)(bVar73 >> 5 & 1);
            auVar141._20_4_ = (uint)bVar76 * auVar91._20_4_ | (uint)!bVar76 * 0x7f800000;
            auVar141._24_4_ =
                 (uint)(bVar73 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar73 >> 6) * 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar141,auVar141,0xb1);
            auVar91 = vminps_avx(auVar141,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar18 = vcmpps_avx512vl(auVar141,auVar91,0);
            bVar70 = (byte)uVar18 & bVar73;
            bVar68 = bVar73;
            if (bVar70 != 0) {
              bVar68 = bVar70;
            }
            iVar22 = 0;
            for (uVar77 = (uint)bVar68; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            uVar77 = *(uint *)(local_340 + (uint)(iVar22 << 2));
            fVar246 = auVar14._0_4_;
            auVar80 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
            if ((float)local_7e0._0_4_ < 0.0) {
              local_860._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
              auVar250 = ZEXT1664(auVar250._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              fVar246 = sqrtf((float)local_7e0._0_4_);
              auVar80 = local_860._0_16_;
            }
            auVar245 = ZEXT464(uVar77);
            auVar78 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar85 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar90 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar86 = vminps_avx(auVar78,auVar90);
            auVar78 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar90 = vmaxps_avx(auVar85,auVar78);
            auVar216._8_4_ = 0x7fffffff;
            auVar216._0_8_ = 0x7fffffff7fffffff;
            auVar216._12_4_ = 0x7fffffff;
            auVar85 = vandps_avx(auVar86,auVar216);
            auVar78 = vandps_avx(auVar90,auVar216);
            auVar85 = vmaxps_avx(auVar85,auVar78);
            auVar78 = vmovshdup_avx(auVar85);
            auVar78 = vmaxss_avx(auVar78,auVar85);
            auVar85 = vshufpd_avx(auVar85,auVar85,1);
            auVar85 = vmaxss_avx(auVar85,auVar78);
            local_830._0_4_ = auVar85._0_4_ * 1.9073486e-06;
            local_6f0 = vshufps_avx(auVar90,auVar90,0xff);
            auVar80 = vinsertps_avx(ZEXT416(uVar77),auVar80,0x10);
            auVar255 = ZEXT1664(auVar80);
            lVar75 = 5;
            do {
              do {
                bVar76 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                if (bVar76) goto LAB_01aa0bdd;
                uVar173 = auVar255._0_4_;
                auVar155._4_4_ = uVar173;
                auVar155._0_4_ = uVar173;
                auVar155._8_4_ = uVar173;
                auVar155._12_4_ = uVar173;
                auVar80 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_7d0);
                local_740 = auVar255._0_32_;
                auVar85 = vmovshdup_avx(auVar255._0_16_);
                fVar226 = auVar85._0_4_;
                fVar208 = 1.0 - fVar226;
                fVar253 = fVar208 * fVar208 * fVar208;
                fVar251 = fVar226 * fVar226;
                fVar228 = fVar226 * fVar251;
                auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                          ZEXT416((uint)fVar228));
                fVar252 = fVar226 * fVar208;
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar252 * 6.0)),
                                          ZEXT416((uint)(fVar208 * fVar252)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                          ZEXT416((uint)fVar253));
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar252 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar226 * fVar252)));
                fVar253 = fVar253 * 0.16666667;
                fVar226 = (auVar78._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar227 = (auVar90._0_4_ + auVar79._0_4_) * 0.16666667;
                fVar228 = fVar228 * 0.16666667;
                auVar197._0_4_ = fVar228 * (float)local_7c0._0_4_;
                auVar197._4_4_ = fVar228 * (float)local_7c0._4_4_;
                auVar197._8_4_ = fVar228 * fStack_7b8;
                auVar197._12_4_ = fVar228 * fStack_7b4;
                auVar230._4_4_ = fVar227;
                auVar230._0_4_ = fVar227;
                auVar230._8_4_ = fVar227;
                auVar230._12_4_ = fVar227;
                auVar78 = vfmadd132ps_fma(auVar230,auVar197,local_780._0_16_);
                auVar198._4_4_ = fVar226;
                auVar198._0_4_ = fVar226;
                auVar198._8_4_ = fVar226;
                auVar198._12_4_ = fVar226;
                auVar78 = vfmadd132ps_fma(auVar198,auVar78,local_7a0._0_16_);
                auVar179._4_4_ = fVar253;
                auVar179._0_4_ = fVar253;
                auVar179._8_4_ = fVar253;
                auVar179._12_4_ = fVar253;
                auVar78 = vfmadd132ps_fma(auVar179,auVar78,local_760._0_16_);
                local_620._0_16_ = auVar78;
                auVar78 = vsubps_avx(auVar80,auVar78);
                auVar80 = vdpps_avx(auVar78,auVar78,0x7f);
                local_800._0_16_ = auVar80;
                local_860._0_16_ = ZEXT416((uint)fVar208);
                if (auVar80._0_4_ < 0.0) {
                  local_880._0_4_ = fVar251;
                  local_8a0._0_4_ = fVar252;
                  auVar250._0_4_ = sqrtf(auVar80._0_4_);
                  auVar250._4_60_ = extraout_var_00;
                  auVar80 = auVar250._0_16_;
                  fVar252 = (float)local_8a0._0_4_;
                  auVar90 = local_860._0_16_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  local_880._0_4_ = fVar251;
                  auVar90 = ZEXT416((uint)fVar208);
                }
                local_640._4_4_ = auVar90._0_4_;
                local_640._0_4_ = local_640._4_4_;
                fStack_638 = (float)local_640._4_4_;
                fStack_634 = (float)local_640._4_4_;
                auVar86 = vfnmsub213ss_fma(auVar85,auVar85,ZEXT416((uint)(fVar252 * 4.0)));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * 4.0)),auVar90,auVar90);
                fVar251 = (float)local_640._4_4_ * -(float)local_640._4_4_ * 0.5;
                fVar252 = auVar86._0_4_ * 0.5;
                fVar253 = auVar90._0_4_ * 0.5;
                local_880._0_4_ = (float)local_880._0_4_ * 0.5;
                auVar217._0_4_ = (float)local_880._0_4_ * (float)local_7c0._0_4_;
                auVar217._4_4_ = (float)local_880._0_4_ * (float)local_7c0._4_4_;
                auVar217._8_4_ = (float)local_880._0_4_ * fStack_7b8;
                auVar217._12_4_ = (float)local_880._0_4_ * fStack_7b4;
                auVar180._4_4_ = fVar253;
                auVar180._0_4_ = fVar253;
                auVar180._8_4_ = fVar253;
                auVar180._12_4_ = fVar253;
                auVar90 = vfmadd132ps_fma(auVar180,auVar217,local_780._0_16_);
                auVar199._4_4_ = fVar252;
                auVar199._0_4_ = fVar252;
                auVar199._8_4_ = fVar252;
                auVar199._12_4_ = fVar252;
                auVar90 = vfmadd132ps_fma(auVar199,auVar90,local_7a0._0_16_);
                auVar261._4_4_ = fVar251;
                auVar261._0_4_ = fVar251;
                auVar261._8_4_ = fVar251;
                auVar261._12_4_ = fVar251;
                _local_880 = vfmadd132ps_fma(auVar261,auVar90,local_760._0_16_);
                local_660._0_16_ = vdpps_avx(_local_880,_local_880,0x7f);
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                fVar251 = local_660._0_4_;
                auVar86 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar251));
                local_680._0_16_ = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar251));
                auVar90 = vfnmadd213ss_fma(local_680._0_16_,local_660._0_16_,ZEXT416(0x40000000));
                local_6a0._0_4_ = auVar90._0_4_;
                local_8a0._0_4_ = auVar80._0_4_;
                if (fVar251 < -fVar251) {
                  local_840 = auVar86;
                  fVar252 = sqrtf(fVar251);
                  auVar80 = ZEXT416((uint)local_8a0._0_4_);
                  auVar90 = local_840;
                  auVar79 = _local_880;
                }
                else {
                  auVar90 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                  fVar252 = auVar90._0_4_;
                  auVar90 = auVar86;
                  auVar79 = _local_880;
                }
                fVar253 = auVar90._0_4_;
                auVar83 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar86._0_4_ * 1.5 +
                                                   fVar251 * -0.5 * fVar253 * fVar253 * fVar253)));
                auVar82 = vmulps_avx512vl(auVar79,auVar83);
                auVar90 = vdpps_avx(auVar78,auVar82,0x7f);
                fVar251 = auVar80._0_4_ + 1.0;
                fVar253 = auVar90._0_4_;
                auVar156._0_4_ = fVar253 * fVar253;
                auVar156._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar156._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar156._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar86 = vsubps_avx(local_800._0_16_,auVar156);
                fVar226 = auVar86._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar226;
                auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar87 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar226 < 0.0) {
                  local_840._0_4_ = fVar251;
                  local_6c0._0_4_ = auVar87._0_4_;
                  _local_6e0 = auVar83;
                  local_6d0 = auVar82;
                  local_6b0 = auVar81;
                  fVar226 = sqrtf(fVar226);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar87 = ZEXT416((uint)local_6c0._0_4_);
                  auVar80 = ZEXT416((uint)local_8a0._0_4_);
                  auVar81 = local_6b0;
                  auVar79 = _local_880;
                  fVar251 = (float)local_840._0_4_;
                  auVar82 = local_6d0;
                  auVar83 = _local_6e0;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar226 = auVar86._0_4_;
                }
                auVar264 = ZEXT1664(auVar79);
                auVar259 = ZEXT1664(local_800._0_16_);
                auVar257 = ZEXT1664(auVar78);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_,auVar85);
                auVar84 = vfmadd213ss_fma(auVar85,SUB6416(ZEXT464(0xc0000000),0),local_860._0_16_);
                auVar254 = local_740._0_16_;
                auVar85 = vshufps_avx(auVar254,auVar254,0x55);
                auVar200._0_4_ = auVar85._0_4_ * (float)local_7c0._0_4_;
                auVar200._4_4_ = auVar85._4_4_ * (float)local_7c0._4_4_;
                auVar200._8_4_ = auVar85._8_4_ * fStack_7b8;
                auVar200._12_4_ = auVar85._12_4_ * fStack_7b4;
                auVar218._0_4_ = auVar84._0_4_;
                auVar218._4_4_ = auVar218._0_4_;
                auVar218._8_4_ = auVar218._0_4_;
                auVar218._12_4_ = auVar218._0_4_;
                auVar85 = vfmadd132ps_fma(auVar218,auVar200,local_780._0_16_);
                auVar182._0_4_ = auVar86._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar85 = vfmadd132ps_fma(auVar182,auVar85,local_7a0._0_16_);
                auVar85 = vfmadd132ps_fma(_local_640,auVar85,local_760._0_16_);
                auVar183._0_4_ = auVar85._0_4_ * (float)local_660._0_4_;
                auVar183._4_4_ = auVar85._4_4_ * (float)local_660._0_4_;
                auVar183._8_4_ = auVar85._8_4_ * (float)local_660._0_4_;
                auVar183._12_4_ = auVar85._12_4_ * (float)local_660._0_4_;
                auVar85 = vdpps_avx(auVar79,auVar85,0x7f);
                fVar227 = auVar85._0_4_;
                auVar201._0_4_ = auVar79._0_4_ * fVar227;
                auVar201._4_4_ = auVar79._4_4_ * fVar227;
                auVar201._8_4_ = auVar79._8_4_ * fVar227;
                auVar201._12_4_ = auVar79._12_4_ * fVar227;
                auVar85 = vsubps_avx(auVar183,auVar201);
                fVar227 = (float)local_6a0._0_4_ * (float)local_680._0_4_;
                auVar84 = vmaxss_avx(ZEXT416((uint)local_830._0_4_),
                                     ZEXT416((uint)(local_740._0_4_ * fVar246 * 1.9073486e-06)));
                auVar202._0_4_ = auVar85._0_4_ * fVar227;
                auVar202._4_4_ = auVar85._4_4_ * fVar227;
                auVar202._8_4_ = auVar85._8_4_ * fVar227;
                auVar202._12_4_ = auVar85._12_4_ * fVar227;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(auVar79,auVar26);
                auVar83 = vmulps_avx512vl(auVar83,auVar202);
                auVar85 = vdpps_avx(auVar89,auVar82,0x7f);
                auVar86 = vfmadd213ss_fma(auVar80,ZEXT416((uint)local_830._0_4_),auVar84);
                auVar80 = vdpps_avx(auVar78,auVar83,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar251),
                                          ZEXT416((uint)((float)local_830._0_4_ / fVar252)),auVar86)
                ;
                fVar251 = auVar85._0_4_ + auVar80._0_4_;
                auVar80 = vdpps_avx(local_7d0,auVar82,0x7f);
                auVar85 = vdpps_avx(auVar78,auVar89,0x7f);
                auVar86 = vmulss_avx512f(auVar88,auVar81);
                auVar87 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar86._0_4_ *
                                                               auVar81._0_4_ * auVar81._0_4_)));
                auVar86 = vdpps_avx(auVar78,local_7d0,0x7f);
                auVar82 = vfnmadd231ss_fma(auVar85,auVar90,ZEXT416((uint)fVar251));
                auVar86 = vfnmadd231ss_fma(auVar86,auVar90,auVar80);
                auVar85 = vpermilps_avx(local_620._0_16_,0xff);
                fVar226 = fVar226 - auVar85._0_4_;
                auVar81 = vshufps_avx(auVar79,auVar79,0xff);
                auVar85 = vfmsub213ss_fma(auVar82,auVar87,auVar81);
                auVar248._8_4_ = 0x80000000;
                auVar248._0_8_ = 0x8000000080000000;
                auVar248._12_4_ = 0x80000000;
                auVar250 = ZEXT1664(auVar248);
                auVar242._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar245 = ZEXT1664(auVar242);
                auVar86 = ZEXT416((uint)(auVar86._0_4_ * auVar87._0_4_));
                auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar251),auVar86);
                auVar85 = vinsertps_avx(auVar242,auVar86,0x1c);
                auVar236._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = auVar80._8_4_ ^ 0x80000000;
                auVar236._12_4_ = auVar80._12_4_ ^ 0x80000000;
                auVar86 = vinsertps_avx(ZEXT416((uint)fVar251),auVar236,0x10);
                auVar219._0_4_ = auVar82._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar80 = vdivps_avx(auVar85,auVar219);
                auVar85 = vdivps_avx(auVar86,auVar219);
                auVar220._0_4_ = fVar253 * auVar80._0_4_ + fVar226 * auVar85._0_4_;
                auVar220._4_4_ = fVar253 * auVar80._4_4_ + fVar226 * auVar85._4_4_;
                auVar220._8_4_ = fVar253 * auVar80._8_4_ + fVar226 * auVar85._8_4_;
                auVar220._12_4_ = fVar253 * auVar80._12_4_ + fVar226 * auVar85._12_4_;
                auVar80 = vsubps_avx(auVar254,auVar220);
                auVar255 = ZEXT1664(auVar80);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(auVar90,auVar27);
              } while (auVar83._0_4_ <= auVar85._0_4_);
              auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar84._0_4_)),local_6f0,
                                        ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx512vl(ZEXT416((uint)fVar226),auVar28);
            } while (auVar85._0_4_ <= auVar90._0_4_);
            fVar246 = auVar80._0_4_ + (float)local_700._0_4_;
            if ((fVar150 <= fVar246) &&
               (fVar251 = *(float *)(ray + k * 4 + 0x100), fVar246 <= fVar251)) {
              auVar85 = vmovshdup_avx(auVar80);
              fVar252 = auVar85._0_4_;
              if ((0.0 <= fVar252) && (fVar252 <= 1.0)) {
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_800._0_4_));
                fVar253 = auVar85._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar1].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar253 = fVar253 * 1.5 + local_800._0_4_ * -0.5 * fVar253 * fVar253 * fVar253;
                  auVar221._0_4_ = auVar78._0_4_ * fVar253;
                  auVar221._4_4_ = auVar78._4_4_ * fVar253;
                  auVar221._8_4_ = auVar78._8_4_ * fVar253;
                  auVar221._12_4_ = auVar78._12_4_ * fVar253;
                  auVar81 = vfmadd213ps_fma(auVar81,auVar221,auVar79);
                  auVar85 = vshufps_avx(auVar221,auVar221,0xc9);
                  auVar90 = vshufps_avx(auVar79,auVar79,0xc9);
                  auVar222._0_4_ = auVar221._0_4_ * auVar90._0_4_;
                  auVar222._4_4_ = auVar221._4_4_ * auVar90._4_4_;
                  auVar222._8_4_ = auVar221._8_4_ * auVar90._8_4_;
                  auVar222._12_4_ = auVar221._12_4_ * auVar90._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar222,auVar79,auVar85);
                  auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar90 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar157._0_4_ = auVar81._0_4_ * auVar86._0_4_;
                  auVar157._4_4_ = auVar81._4_4_ * auVar86._4_4_;
                  auVar157._8_4_ = auVar81._8_4_ * auVar86._8_4_;
                  auVar157._12_4_ = auVar81._12_4_ * auVar86._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar157,auVar85,auVar90);
                  uVar173 = auVar85._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                    uVar3 = vextractps_avx(auVar85,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar85,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar173;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar252;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(uint *)(ray + k * 4 + 0x220) = uVar2;
                    *(uint *)(ray + k * 4 + 0x240) = uVar1;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar6 = context->user;
                    auVar224._8_4_ = 1;
                    auVar224._0_8_ = 0x100000001;
                    auVar224._12_4_ = 1;
                    auVar224._16_4_ = 1;
                    auVar224._20_4_ = 1;
                    auVar224._24_4_ = 1;
                    auVar224._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar224,ZEXT1632(auVar80));
                    auVar91 = vpermps_avx2(auVar224,ZEXT1632(auVar85));
                    auVar234._8_4_ = 2;
                    auVar234._0_8_ = 0x200000002;
                    auVar234._12_4_ = 2;
                    auVar234._16_4_ = 2;
                    auVar234._20_4_ = 2;
                    auVar234._24_4_ = 2;
                    auVar234._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar234,ZEXT1632(auVar85));
                    local_480[0] = (RTCHitN)auVar91[0];
                    local_480[1] = (RTCHitN)auVar91[1];
                    local_480[2] = (RTCHitN)auVar91[2];
                    local_480[3] = (RTCHitN)auVar91[3];
                    local_480[4] = (RTCHitN)auVar91[4];
                    local_480[5] = (RTCHitN)auVar91[5];
                    local_480[6] = (RTCHitN)auVar91[6];
                    local_480[7] = (RTCHitN)auVar91[7];
                    local_480[8] = (RTCHitN)auVar91[8];
                    local_480[9] = (RTCHitN)auVar91[9];
                    local_480[10] = (RTCHitN)auVar91[10];
                    local_480[0xb] = (RTCHitN)auVar91[0xb];
                    local_480[0xc] = (RTCHitN)auVar91[0xc];
                    local_480[0xd] = (RTCHitN)auVar91[0xd];
                    local_480[0xe] = (RTCHitN)auVar91[0xe];
                    local_480[0xf] = (RTCHitN)auVar91[0xf];
                    local_480[0x10] = (RTCHitN)auVar91[0x10];
                    local_480[0x11] = (RTCHitN)auVar91[0x11];
                    local_480[0x12] = (RTCHitN)auVar91[0x12];
                    local_480[0x13] = (RTCHitN)auVar91[0x13];
                    local_480[0x14] = (RTCHitN)auVar91[0x14];
                    local_480[0x15] = (RTCHitN)auVar91[0x15];
                    local_480[0x16] = (RTCHitN)auVar91[0x16];
                    local_480[0x17] = (RTCHitN)auVar91[0x17];
                    local_480[0x18] = (RTCHitN)auVar91[0x18];
                    local_480[0x19] = (RTCHitN)auVar91[0x19];
                    local_480[0x1a] = (RTCHitN)auVar91[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar91[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar91[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar91[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar91[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar91[0x1f];
                    local_440 = uVar173;
                    uStack_43c = uVar173;
                    uStack_438 = uVar173;
                    uStack_434 = uVar173;
                    uStack_430 = uVar173;
                    uStack_42c = uVar173;
                    uStack_428 = uVar173;
                    uStack_424 = uVar173;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar91 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_818[1] = auVar91;
                    *local_818 = auVar91;
                    local_3a0 = pRVar6->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar6->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar246;
                    local_720 = local_520;
                    local_8d0.valid = (int *)local_720;
                    local_8d0.geometryUserPtr = pGVar4->userPtr;
                    local_8d0.context = context->user;
                    local_8d0.hit = local_480;
                    local_8d0.N = 8;
                    local_8d0.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar245 = ZEXT1664(auVar242);
                      auVar250 = ZEXT1664(auVar248);
                      auVar255 = ZEXT1664(auVar80);
                      auVar257 = ZEXT1664(auVar78);
                      auVar259 = ZEXT1664(local_800._0_16_);
                      auVar264 = ZEXT1664(auVar79);
                      (*pGVar4->intersectionFilterN)(&local_8d0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar245 = ZEXT1664(auVar245._0_16_);
                        auVar250 = ZEXT1664(auVar250._0_16_);
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar257 = ZEXT1664(auVar257._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        (*p_Var5)(&local_8d0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar74 = vptestmd_avx512vl(local_720,local_720);
                        iVar57 = *(int *)(local_8d0.hit + 4);
                        iVar58 = *(int *)(local_8d0.hit + 8);
                        iVar59 = *(int *)(local_8d0.hit + 0xc);
                        iVar60 = *(int *)(local_8d0.hit + 0x10);
                        iVar61 = *(int *)(local_8d0.hit + 0x14);
                        iVar62 = *(int *)(local_8d0.hit + 0x18);
                        iVar63 = *(int *)(local_8d0.hit + 0x1c);
                        bVar68 = (byte)uVar74;
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x180) =
                             (uint)(bVar68 & 1) * *(int *)local_8d0.hit |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8d0.ray + 0x180);
                        *(uint *)(local_8d0.ray + 0x184) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x184)
                        ;
                        *(uint *)(local_8d0.ray + 0x188) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x188);
                        *(uint *)(local_8d0.ray + 0x18c) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x18c);
                        *(uint *)(local_8d0.ray + 400) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 400);
                        *(uint *)(local_8d0.ray + 0x194) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x194)
                        ;
                        *(uint *)(local_8d0.ray + 0x198) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x198)
                        ;
                        *(uint *)(local_8d0.ray + 0x19c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x19c)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x24);
                        iVar58 = *(int *)(local_8d0.hit + 0x28);
                        iVar59 = *(int *)(local_8d0.hit + 0x2c);
                        iVar60 = *(int *)(local_8d0.hit + 0x30);
                        iVar61 = *(int *)(local_8d0.hit + 0x34);
                        iVar62 = *(int *)(local_8d0.hit + 0x38);
                        iVar63 = *(int *)(local_8d0.hit + 0x3c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1a0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8d0.hit + 0x20) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                        *(uint *)(local_8d0.ray + 0x1a4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1a4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1a8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1a8);
                        *(uint *)(local_8d0.ray + 0x1ac) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1ac);
                        *(uint *)(local_8d0.ray + 0x1b0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1b0);
                        *(uint *)(local_8d0.ray + 0x1b4) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1b8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1bc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1bc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x44);
                        iVar58 = *(int *)(local_8d0.hit + 0x48);
                        iVar59 = *(int *)(local_8d0.hit + 0x4c);
                        iVar60 = *(int *)(local_8d0.hit + 0x50);
                        iVar61 = *(int *)(local_8d0.hit + 0x54);
                        iVar62 = *(int *)(local_8d0.hit + 0x58);
                        iVar63 = *(int *)(local_8d0.hit + 0x5c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1c0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8d0.hit + 0x40) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                        *(uint *)(local_8d0.ray + 0x1c4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1c4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1c8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1c8);
                        *(uint *)(local_8d0.ray + 0x1cc) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1cc);
                        *(uint *)(local_8d0.ray + 0x1d0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1d0);
                        *(uint *)(local_8d0.ray + 0x1d4) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1d8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1dc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1dc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 100);
                        iVar58 = *(int *)(local_8d0.hit + 0x68);
                        iVar59 = *(int *)(local_8d0.hit + 0x6c);
                        iVar60 = *(int *)(local_8d0.hit + 0x70);
                        iVar61 = *(int *)(local_8d0.hit + 0x74);
                        iVar62 = *(int *)(local_8d0.hit + 0x78);
                        iVar63 = *(int *)(local_8d0.hit + 0x7c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x1e0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8d0.hit + 0x60) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                        *(uint *)(local_8d0.ray + 0x1e4) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x1e4)
                        ;
                        *(uint *)(local_8d0.ray + 0x1e8) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x1e8);
                        *(uint *)(local_8d0.ray + 0x1ec) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x1ec);
                        *(uint *)(local_8d0.ray + 0x1f0) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x1f0);
                        *(uint *)(local_8d0.ray + 500) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 500);
                        *(uint *)(local_8d0.ray + 0x1f8) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8d0.ray + 0x1fc) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1fc)
                        ;
                        iVar57 = *(int *)(local_8d0.hit + 0x84);
                        iVar58 = *(int *)(local_8d0.hit + 0x88);
                        iVar59 = *(int *)(local_8d0.hit + 0x8c);
                        iVar60 = *(int *)(local_8d0.hit + 0x90);
                        iVar61 = *(int *)(local_8d0.hit + 0x94);
                        iVar62 = *(int *)(local_8d0.hit + 0x98);
                        iVar63 = *(int *)(local_8d0.hit + 0x9c);
                        bVar76 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar74 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar74 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar74 >> 6) & 1);
                        bVar12 = SUB81(uVar74 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x200) =
                             (uint)(bVar68 & 1) * *(int *)(local_8d0.hit + 0x80) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8d0.ray + 0x200);
                        *(uint *)(local_8d0.ray + 0x204) =
                             (uint)bVar76 * iVar57 | (uint)!bVar76 * *(int *)(local_8d0.ray + 0x204)
                        ;
                        *(uint *)(local_8d0.ray + 0x208) =
                             (uint)bVar7 * iVar58 | (uint)!bVar7 * *(int *)(local_8d0.ray + 0x208);
                        *(uint *)(local_8d0.ray + 0x20c) =
                             (uint)bVar8 * iVar59 | (uint)!bVar8 * *(int *)(local_8d0.ray + 0x20c);
                        *(uint *)(local_8d0.ray + 0x210) =
                             (uint)bVar9 * iVar60 | (uint)!bVar9 * *(int *)(local_8d0.ray + 0x210);
                        *(uint *)(local_8d0.ray + 0x214) =
                             (uint)bVar10 * iVar61 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x214)
                        ;
                        *(uint *)(local_8d0.ray + 0x218) =
                             (uint)bVar11 * iVar62 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x218)
                        ;
                        *(uint *)(local_8d0.ray + 0x21c) =
                             (uint)bVar12 * iVar63 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x21c)
                        ;
                        auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar91;
                        auVar91 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar91;
                        auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar91;
                        auVar91 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                        *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar91;
                        goto LAB_01aa0bdd;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar251;
                  }
                }
              }
            }
LAB_01aa0bdd:
            uVar173 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar238._4_4_ = uVar173;
            auVar238._0_4_ = uVar173;
            auVar238._8_4_ = uVar173;
            auVar238._12_4_ = uVar173;
            auVar238._16_4_ = uVar173;
            auVar238._20_4_ = uVar173;
            auVar238._24_4_ = uVar173;
            auVar238._28_4_ = uVar173;
            auVar239 = ZEXT3264(auVar238);
            auVar65._4_4_ = fStack_55c;
            auVar65._0_4_ = local_560;
            auVar65._8_4_ = fStack_558;
            auVar65._12_4_ = fStack_554;
            auVar65._16_4_ = fStack_550;
            auVar65._20_4_ = fStack_54c;
            auVar65._24_4_ = fStack_548;
            auVar65._28_4_ = fStack_544;
            uVar18 = vcmpps_avx512vl(auVar238,auVar65,0xd);
          }
          uVar21 = vpcmpd_avx512vl(local_500,local_320,1);
          uVar20 = vpcmpd_avx512vl(local_500,_local_580,1);
          auVar186._0_4_ = (float)local_5a0._0_4_ + (float)local_200._0_4_;
          auVar186._4_4_ = (float)local_5a0._4_4_ + (float)local_200._4_4_;
          auVar186._8_4_ = fStack_598 + fStack_1f8;
          auVar186._12_4_ = fStack_594 + fStack_1f4;
          auVar186._16_4_ = fStack_590 + fStack_1f0;
          auVar186._20_4_ = fStack_58c + fStack_1ec;
          auVar186._24_4_ = fStack_588 + fStack_1e8;
          auVar186._28_4_ = fStack_584 + fStack_1e4;
          uVar173 = auVar239._0_4_;
          auVar203._4_4_ = uVar173;
          auVar203._0_4_ = uVar173;
          auVar203._8_4_ = uVar173;
          auVar203._12_4_ = uVar173;
          auVar203._16_4_ = uVar173;
          auVar203._20_4_ = uVar173;
          auVar203._24_4_ = uVar173;
          auVar203._28_4_ = uVar173;
          uVar18 = vcmpps_avx512vl(auVar186,auVar203,2);
          bVar71 = bVar71 & (byte)uVar21 & (byte)uVar18;
          auVar225._0_4_ = (float)local_5a0._0_4_ + (float)local_360._0_4_;
          auVar225._4_4_ = (float)local_5a0._4_4_ + (float)local_360._4_4_;
          auVar225._8_4_ = fStack_598 + fStack_358;
          auVar225._12_4_ = fStack_594 + fStack_354;
          auVar225._16_4_ = fStack_590 + fStack_350;
          auVar225._20_4_ = fStack_58c + fStack_34c;
          auVar225._24_4_ = fStack_588 + fStack_348;
          auVar225._28_4_ = fStack_584 + fStack_344;
          uVar18 = vcmpps_avx512vl(auVar225,auVar203,2);
          bVar67 = bVar67 & (byte)uVar20 & (byte)uVar18 | bVar71;
          if (bVar67 != 0) {
            abStack_180[uVar72 * 0x60] = bVar67;
            bVar76 = (bool)(bVar71 >> 1 & 1);
            bVar7 = (bool)(bVar71 >> 2 & 1);
            bVar8 = (bool)(bVar71 >> 3 & 1);
            bVar9 = (bool)(bVar71 >> 4 & 1);
            bVar10 = (bool)(bVar71 >> 5 & 1);
            auStack_160[uVar72 * 0x18] =
                 (uint)(bVar71 & 1) * local_200._0_4_ | (uint)!(bool)(bVar71 & 1) * local_360._0_4_;
            auStack_160[uVar72 * 0x18 + 1] =
                 (uint)bVar76 * local_200._4_4_ | (uint)!bVar76 * local_360._4_4_;
            auStack_160[uVar72 * 0x18 + 2] =
                 (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)fStack_358;
            auStack_160[uVar72 * 0x18 + 3] =
                 (uint)bVar8 * (int)fStack_1f4 | (uint)!bVar8 * (int)fStack_354;
            auStack_160[uVar72 * 0x18 + 4] =
                 (uint)bVar9 * (int)fStack_1f0 | (uint)!bVar9 * (int)fStack_350;
            auStack_160[uVar72 * 0x18 + 5] =
                 (uint)bVar10 * (int)fStack_1ec | (uint)!bVar10 * (int)fStack_34c;
            auStack_160[uVar72 * 0x18 + 6] =
                 (uint)(bVar71 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar71 >> 6) * (int)fStack_348;
            (&fStack_144)[uVar72 * 0x18] = fStack_344;
            uVar74 = vmovlps_avx(local_530);
            (&uStack_140)[uVar72 * 0xc] = uVar74;
            aiStack_138[uVar72 * 0x18] = local_b1c + 1;
            uVar72 = (ulong)((int)uVar72 + 1);
          }
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar266 = ZEXT3264(auVar91);
          auVar239 = ZEXT3264(_DAT_01f7b040);
          prim = local_810;
        }
      }
    }
    do {
      uVar77 = (uint)uVar72;
      uVar72 = (ulong)(uVar77 - 1);
      if (uVar77 == 0) {
        uVar173 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar35._4_4_ = uVar173;
        auVar35._0_4_ = uVar173;
        auVar35._8_4_ = uVar173;
        auVar35._12_4_ = uVar173;
        auVar35._16_4_ = uVar173;
        auVar35._20_4_ = uVar173;
        auVar35._24_4_ = uVar173;
        auVar35._28_4_ = uVar173;
        uVar18 = vcmpps_avx512vl(local_300,auVar35,2);
        local_808 = (ulong)((uint)local_808 & (uint)uVar18);
        goto LAB_01a9e573;
      }
      auVar91 = *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x18);
      auVar187._0_4_ = auVar91._0_4_ + (float)local_5a0._0_4_;
      auVar187._4_4_ = auVar91._4_4_ + (float)local_5a0._4_4_;
      auVar187._8_4_ = auVar91._8_4_ + fStack_598;
      auVar187._12_4_ = auVar91._12_4_ + fStack_594;
      auVar187._16_4_ = auVar91._16_4_ + fStack_590;
      auVar187._20_4_ = auVar91._20_4_ + fStack_58c;
      auVar187._24_4_ = auVar91._24_4_ + fStack_588;
      auVar187._28_4_ = auVar91._28_4_ + fStack_584;
      uVar173 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar34._4_4_ = uVar173;
      auVar34._0_4_ = uVar173;
      auVar34._8_4_ = uVar173;
      auVar34._12_4_ = uVar173;
      auVar34._16_4_ = uVar173;
      auVar34._20_4_ = uVar173;
      auVar34._24_4_ = uVar173;
      auVar34._28_4_ = uVar173;
      uVar18 = vcmpps_avx512vl(auVar187,auVar34,2);
      uVar143 = (uint)uVar18 & (uint)abStack_180[uVar72 * 0x60];
    } while (uVar143 == 0);
    uVar74 = (&uStack_140)[uVar72 * 0xc];
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar74;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar204,auVar91);
    bVar67 = (byte)uVar143;
    auVar142._0_4_ =
         (uint)(bVar67 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar91._0_4_;
    bVar76 = (bool)((byte)(uVar143 >> 1) & 1);
    auVar142._4_4_ = (uint)bVar76 * auVar92._4_4_ | (uint)!bVar76 * (int)auVar91._4_4_;
    bVar76 = (bool)((byte)(uVar143 >> 2) & 1);
    auVar142._8_4_ = (uint)bVar76 * auVar92._8_4_ | (uint)!bVar76 * (int)auVar91._8_4_;
    bVar76 = (bool)((byte)(uVar143 >> 3) & 1);
    auVar142._12_4_ = (uint)bVar76 * auVar92._12_4_ | (uint)!bVar76 * (int)auVar91._12_4_;
    bVar76 = (bool)((byte)(uVar143 >> 4) & 1);
    auVar142._16_4_ = (uint)bVar76 * auVar92._16_4_ | (uint)!bVar76 * (int)auVar91._16_4_;
    bVar76 = (bool)((byte)(uVar143 >> 5) & 1);
    auVar142._20_4_ = (uint)bVar76 * auVar92._20_4_ | (uint)!bVar76 * (int)auVar91._20_4_;
    bVar76 = (bool)((byte)(uVar143 >> 6) & 1);
    auVar142._24_4_ = (uint)bVar76 * auVar92._24_4_ | (uint)!bVar76 * (int)auVar91._24_4_;
    auVar142._28_4_ =
         (uVar143 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar143 >> 7,0) * (int)auVar91._28_4_;
    auVar91 = vshufps_avx(auVar142,auVar142,0xb1);
    auVar91 = vminps_avx(auVar142,auVar91);
    auVar92 = vshufpd_avx(auVar91,auVar91,5);
    auVar91 = vminps_avx(auVar91,auVar92);
    auVar92 = vpermpd_avx2(auVar91,0x4e);
    auVar91 = vminps_avx(auVar91,auVar92);
    uVar18 = vcmpps_avx512vl(auVar142,auVar91,0);
    bVar73 = (byte)uVar18 & bVar67;
    if (bVar73 != 0) {
      uVar143 = (uint)bVar73;
    }
    uVar144 = 0;
    for (; (uVar143 & 1) == 0; uVar143 = uVar143 >> 1 | 0x80000000) {
      uVar144 = uVar144 + 1;
    }
    local_b1c = aiStack_138[uVar72 * 0x18];
    bVar67 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar67;
    abStack_180[uVar72 * 0x60] = bVar67;
    if (bVar67 == 0) {
      uVar77 = uVar77 - 1;
    }
    uVar173 = (undefined4)uVar74;
    auVar166._4_4_ = uVar173;
    auVar166._0_4_ = uVar173;
    auVar166._8_4_ = uVar173;
    auVar166._12_4_ = uVar173;
    auVar166._16_4_ = uVar173;
    auVar166._20_4_ = uVar173;
    auVar166._24_4_ = uVar173;
    auVar166._28_4_ = uVar173;
    auVar80 = vmovshdup_avx(auVar184);
    auVar80 = vsubps_avx(auVar80,auVar184);
    auVar188._0_4_ = auVar80._0_4_;
    auVar188._4_4_ = auVar188._0_4_;
    auVar188._8_4_ = auVar188._0_4_;
    auVar188._12_4_ = auVar188._0_4_;
    auVar188._16_4_ = auVar188._0_4_;
    auVar188._20_4_ = auVar188._0_4_;
    auVar188._24_4_ = auVar188._0_4_;
    auVar188._28_4_ = auVar188._0_4_;
    auVar80 = vfmadd132ps_fma(auVar188,auVar166,auVar239._0_32_);
    auVar91 = ZEXT1632(auVar80);
    local_480[0] = (RTCHitN)auVar91[0];
    local_480[1] = (RTCHitN)auVar91[1];
    local_480[2] = (RTCHitN)auVar91[2];
    local_480[3] = (RTCHitN)auVar91[3];
    local_480[4] = (RTCHitN)auVar91[4];
    local_480[5] = (RTCHitN)auVar91[5];
    local_480[6] = (RTCHitN)auVar91[6];
    local_480[7] = (RTCHitN)auVar91[7];
    local_480[8] = (RTCHitN)auVar91[8];
    local_480[9] = (RTCHitN)auVar91[9];
    local_480[10] = (RTCHitN)auVar91[10];
    local_480[0xb] = (RTCHitN)auVar91[0xb];
    local_480[0xc] = (RTCHitN)auVar91[0xc];
    local_480[0xd] = (RTCHitN)auVar91[0xd];
    local_480[0xe] = (RTCHitN)auVar91[0xe];
    local_480[0xf] = (RTCHitN)auVar91[0xf];
    local_480[0x10] = (RTCHitN)auVar91[0x10];
    local_480[0x11] = (RTCHitN)auVar91[0x11];
    local_480[0x12] = (RTCHitN)auVar91[0x12];
    local_480[0x13] = (RTCHitN)auVar91[0x13];
    local_480[0x14] = (RTCHitN)auVar91[0x14];
    local_480[0x15] = (RTCHitN)auVar91[0x15];
    local_480[0x16] = (RTCHitN)auVar91[0x16];
    local_480[0x17] = (RTCHitN)auVar91[0x17];
    local_480[0x18] = (RTCHitN)auVar91[0x18];
    local_480[0x19] = (RTCHitN)auVar91[0x19];
    local_480[0x1a] = (RTCHitN)auVar91[0x1a];
    local_480[0x1b] = (RTCHitN)auVar91[0x1b];
    local_480[0x1c] = (RTCHitN)auVar91[0x1c];
    local_480[0x1d] = (RTCHitN)auVar91[0x1d];
    local_480[0x1e] = (RTCHitN)auVar91[0x1e];
    local_480[0x1f] = (RTCHitN)auVar91[0x1f];
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_480 + (ulong)uVar144 * 4);
    uVar72 = (ulong)uVar77;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }